

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O3

ex_ex * ex_eval(expr *expr,ex_ex *eptr,ex_ex *optr,int idx)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  ex_ex *peVar5;
  t_float *ptVar6;
  anon_union_8_5_735de1bb_for_ex_cont aVar7;
  undefined1 uVar8;
  undefined4 uVar9;
  long lVar10;
  anon_union_8_5_735de1bb_for_ex_cont aVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  char *pcVar15;
  undefined8 uVar16;
  bool bVar17;
  float fVar18;
  t_float tVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  int iVar189;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  anon_union_8_5_735de1bb_for_ex_cont local_78;
  long lStack_70;
  undefined8 local_68;
  anon_union_8_5_735de1bb_for_ex_cont local_58;
  long lStack_50;
  undefined8 local_48;
  t_float local_34;
  
  auVar2 = _DAT_001b53a0;
  auVar88 = _DAT_001b5390;
  auVar87 = _DAT_001b5380;
  local_48 = 0;
  local_68 = 0;
  local_58.v_int = 0;
  lStack_50 = 0;
  local_78.v_int = 0;
  lStack_70 = 0;
  if (eptr == (ex_ex *)0x0) {
    return (ex_ex *)0x0;
  }
  uVar12 = eptr->ex_type;
  switch(uVar12) {
  case 1:
    if (optr->ex_type == 0xf) {
      uVar12 = (ulong)(uint)expr->exp_vsize;
      if (uVar12 != 0) {
        fVar18 = (float)(eptr->ex_cont).v_int;
        ptVar6 = (optr->ex_cont).v_vec;
        lVar10 = uVar12 - 1;
        auVar23._8_4_ = (int)lVar10;
        auVar23._0_8_ = lVar10;
        auVar23._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar13 = 0;
        auVar23 = auVar23 ^ _DAT_001b53a0;
        do {
          auVar110._8_4_ = (int)uVar13;
          auVar110._0_8_ = uVar13;
          auVar110._12_4_ = (int)(uVar13 >> 0x20);
          auVar25 = (auVar110 | auVar88) ^ auVar2;
          iVar3 = auVar23._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar3 && auVar23._0_4_ < auVar25._0_4_ ||
                      iVar3 < auVar25._4_4_) & 1)) {
            ptVar6[uVar13] = fVar18;
          }
          if ((auVar25._12_4_ != auVar23._12_4_ || auVar25._8_4_ <= auVar23._8_4_) &&
              auVar25._12_4_ <= auVar23._12_4_) {
            ptVar6[uVar13 + 1] = fVar18;
          }
          auVar25 = (auVar110 | auVar87) ^ auVar2;
          iVar14 = auVar25._4_4_;
          if (iVar14 <= iVar3 && (iVar14 != iVar3 || auVar25._0_4_ <= auVar23._0_4_)) {
            ptVar6[uVar13 + 2] = fVar18;
            ptVar6[uVar13 + 3] = fVar18;
          }
          uVar13 = uVar13 + 4;
        } while ((uVar12 + 3 & 0xfffffffffffffffc) != uVar13);
      }
      goto LAB_00191b6f;
    }
    break;
  case 2:
    if (optr->ex_type == 0xf) {
      uVar12 = (ulong)(uint)expr->exp_vsize;
      if (uVar12 != 0) {
        tVar19 = (eptr->ex_cont).v_flt;
        ptVar6 = (optr->ex_cont).v_vec;
        lVar10 = uVar12 - 1;
        auVar22._8_4_ = (int)lVar10;
        auVar22._0_8_ = lVar10;
        auVar22._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar13 = 0;
        auVar22 = auVar22 ^ _DAT_001b53a0;
        do {
          auVar109._8_4_ = (int)uVar13;
          auVar109._0_8_ = uVar13;
          auVar109._12_4_ = (int)(uVar13 >> 0x20);
          auVar25 = (auVar109 | auVar88) ^ auVar2;
          iVar3 = auVar22._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar3 && auVar22._0_4_ < auVar25._0_4_ ||
                      iVar3 < auVar25._4_4_) & 1)) {
            ptVar6[uVar13] = tVar19;
          }
          if ((auVar25._12_4_ != auVar22._12_4_ || auVar25._8_4_ <= auVar22._8_4_) &&
              auVar25._12_4_ <= auVar22._12_4_) {
            ptVar6[uVar13 + 1] = tVar19;
          }
          auVar25 = (auVar109 | auVar87) ^ auVar2;
          iVar14 = auVar25._4_4_;
          if (iVar14 <= iVar3 && (iVar14 != iVar3 || auVar25._0_4_ <= auVar22._0_4_)) {
            ptVar6[uVar13 + 2] = tVar19;
            ptVar6[uVar13 + 3] = tVar19;
          }
          uVar13 = uVar13 + 4;
        } while ((uVar12 + 3 & 0xfffffffffffffffc) != uVar13);
      }
      goto LAB_00191b6f;
    }
    break;
  case 3:
    if (eptr[1].ex_type == 0) {
      pcVar15 = "expr: ex_eval: not enough nodes 1\n";
      goto LAB_00191d14;
    }
    lVar10 = (eptr->ex_cont).v_int;
    if ((2 < lVar10 - 0xe0015U) && (eptr[2].ex_type == 0)) {
      pcVar15 = "expr: ex_eval: not enough nodes 2\n";
      goto LAB_00191d14;
    }
    peVar5 = eptr + 1;
    if (lVar10 < 0xb000e) {
      if (lVar10 < 0x90008) {
        if (lVar10 < 0x60005) {
          if (lVar10 == 0x3001c) {
            peVar5 = eval_store(expr,peVar5,optr,idx);
            return peVar5;
          }
          if (lVar10 == 0x40003) {
            peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
            peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
            auVar2 = _DAT_001b53a0;
            auVar88 = _DAT_001b5390;
            auVar87 = _DAT_001b5380;
            if (lStack_50 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar6 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) {
LAB_0019b5d6:
                  uVar16 = 0x4e4;
                  goto LAB_0019b671;
                }
                optr->ex_type = 0xf;
                ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar6;
              }
              if (lStack_70 - 0xeU < 2) {
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    tVar19 = 1.0;
                    if (((int)local_58.v_vec[lVar10] == 0) &&
                       (tVar19 = 1.0, (int)local_78.v_vec[lVar10] == 0)) {
                      tVar19 = 0.0;
                    }
                    ptVar6[lVar10] = tVar19;
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    tVar19 = 1.0;
                    if ((int)local_58.v_vec[lVar10] == 0 && (int)local_78.v_flt == 0) {
                      tVar19 = 0.0;
                    }
                    ptVar6[lVar10] = tVar19;
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 1) {
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    tVar19 = 1.0;
                    if ((int)local_58.v_vec[lVar10] == 0 && (int)(float)local_78.v_int == 0) {
                      tVar19 = 0.0;
                    }
                    ptVar6[lVar10] = tVar19;
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
LAB_001958a1:
              pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
              peVar5 = (ex_ex *)0x0;
            }
            else {
              fVar18 = local_78.v_flt;
              if (lStack_50 == 2) {
                if (lStack_70 - 0xeU < 2) {
                  if (optr->ex_type != 0xf) {
                    if (optr->ex_type == 0xe) goto LAB_0019b5d6;
                    optr->ex_type = 0xf;
                    ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                    (optr->ex_cont).v_vec = ptVar6;
                  }
                  iVar3 = expr->exp_vsize;
                  if (0 < iVar3) {
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = 0;
                    do {
                      tVar19 = 1.0;
                      if (((int)local_58.v_flt == 0) &&
                         (tVar19 = 1.0, (int)local_78.v_vec[lVar10] == 0)) {
                        tVar19 = 0.0;
                      }
                      ptVar6[lVar10] = tVar19;
                      lVar10 = lVar10 + 1;
                    } while (iVar3 != (int)lVar10);
                  }
                  goto LAB_00195983;
                }
                if (lStack_70 == 2) {
                  if (optr->ex_type == 0xf) {
                    auVar67._0_4_ = -(uint)((int)fVar18 == 0);
                    auVar67._4_4_ = -(uint)((int)fVar18 == 0);
                    auVar67._8_4_ = -(uint)((int)local_58.v_flt == 0);
                    auVar67._12_4_ = -(uint)((int)local_58.v_flt == 0);
                    iVar3 = movmskpd((int)(lStack_70 - 0xeU),auVar67);
                    if (iVar3 == 3) {
                      tVar19 = 0.0;
                    }
                    else {
                      tVar19 = 1.0;
                    }
                    iVar3 = expr->exp_vsize;
                    if (0 < (long)iVar3) {
                      ptVar6 = (optr->ex_cont).v_vec;
                      lVar10 = (long)iVar3 + -1;
                      auVar92._8_4_ = (int)lVar10;
                      auVar92._0_8_ = lVar10;
                      auVar92._12_4_ = (int)((ulong)lVar10 >> 0x20);
                      uVar12 = 0;
                      auVar92 = auVar92 ^ _DAT_001b53a0;
                      do {
                        auVar174._8_4_ = (int)uVar12;
                        auVar174._0_8_ = uVar12;
                        auVar174._12_4_ = (int)(uVar12 >> 0x20);
                        auVar25 = (auVar174 | auVar88) ^ auVar2;
                        iVar14 = auVar92._4_4_;
                        if ((bool)(~(auVar25._4_4_ == iVar14 && auVar92._0_4_ < auVar25._0_4_ ||
                                    iVar14 < auVar25._4_4_) & 1)) {
                          ptVar6[uVar12] = tVar19;
                        }
                        if ((auVar25._12_4_ != auVar92._12_4_ || auVar25._8_4_ <= auVar92._8_4_) &&
                            auVar25._12_4_ <= auVar92._12_4_) {
                          ptVar6[uVar12 + 1] = tVar19;
                        }
                        auVar25 = (auVar174 | auVar87) ^ auVar2;
                        iVar189 = auVar25._4_4_;
                        if (iVar189 <= iVar14 &&
                            (iVar189 != iVar14 || auVar25._0_4_ <= auVar92._0_4_)) {
                          ptVar6[uVar12 + 2] = tVar19;
                          ptVar6[uVar12 + 3] = tVar19;
                        }
                        uVar12 = uVar12 + 4;
                      } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                    }
                    goto LAB_00195983;
                  }
                  optr->ex_type = 2;
                  uVar9 = local_58.v_flt;
LAB_00199ba3:
                  auVar87._0_4_ = -(uint)((int)fVar18 == 0);
                  auVar87._4_4_ = -(uint)((int)fVar18 == 0);
                  auVar87._8_4_ = -(uint)((int)(float)uVar9 == 0);
                  auVar87._12_4_ = -(uint)((int)(float)uVar9 == 0);
                  iVar3 = movmskpd((int)lStack_70 + -0xe,auVar87);
                  if (iVar3 == 3) goto LAB_00199bbc;
                }
                else {
                  if (lStack_70 != 1) goto LAB_001958a1;
                  if (optr->ex_type == 0xf) {
                    if (fVar18 == 0.0 && (int)local_58.v_flt == 0) {
                      tVar19 = 0.0;
                    }
                    else {
                      tVar19 = 1.0;
                    }
                    iVar3 = expr->exp_vsize;
                    if (0 < (long)iVar3) {
                      ptVar6 = (optr->ex_cont).v_vec;
                      lVar10 = (long)iVar3 + -1;
                      auVar90._8_4_ = (int)lVar10;
                      auVar90._0_8_ = lVar10;
                      auVar90._12_4_ = (int)((ulong)lVar10 >> 0x20);
                      uVar12 = 0;
                      auVar90 = auVar90 ^ _DAT_001b53a0;
                      do {
                        auVar172._8_4_ = (int)uVar12;
                        auVar172._0_8_ = uVar12;
                        auVar172._12_4_ = (int)(uVar12 >> 0x20);
                        auVar25 = (auVar172 | auVar88) ^ auVar2;
                        iVar14 = auVar90._4_4_;
                        if ((bool)(~(auVar25._4_4_ == iVar14 && auVar90._0_4_ < auVar25._0_4_ ||
                                    iVar14 < auVar25._4_4_) & 1)) {
                          ptVar6[uVar12] = tVar19;
                        }
                        if ((auVar25._12_4_ != auVar90._12_4_ || auVar25._8_4_ <= auVar90._8_4_) &&
                            auVar25._12_4_ <= auVar90._12_4_) {
                          ptVar6[uVar12 + 1] = tVar19;
                        }
                        auVar25 = (auVar172 | auVar87) ^ auVar2;
                        iVar189 = auVar25._4_4_;
                        if (iVar189 <= iVar14 &&
                            (iVar189 != iVar14 || auVar25._0_4_ <= auVar90._0_4_)) {
                          ptVar6[uVar12 + 2] = tVar19;
                          ptVar6[uVar12 + 3] = tVar19;
                        }
                        uVar12 = uVar12 + 4;
                      } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                    }
                    goto LAB_00195983;
                  }
                  optr->ex_type = 2;
                  if (fVar18 == 0.0 && (int)local_58.v_flt == 0) goto LAB_00199bbc;
                }
LAB_00199cbf:
                tVar19 = 1.0;
LAB_00199fc9:
                (optr->ex_cont).v_flt = tVar19;
                goto LAB_00195983;
              }
              if (lStack_50 == 1) {
                if (lStack_70 - 0xeU < 2) {
                  if (optr->ex_type != 0xf) {
                    if (optr->ex_type == 0xe) goto LAB_0019b5d6;
                    optr->ex_type = 0xf;
                    ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                    (optr->ex_cont).v_vec = ptVar6;
                  }
                  iVar3 = expr->exp_vsize;
                  if (0 < iVar3) {
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = 0;
                    do {
                      tVar19 = 1.0;
                      if (((int)(float)local_58.v_int == 0) &&
                         (tVar19 = 1.0, (int)local_78.v_vec[lVar10] == 0)) {
                        tVar19 = 0.0;
                      }
                      ptVar6[lVar10] = tVar19;
                      lVar10 = lVar10 + 1;
                    } while (iVar3 != (int)lVar10);
                  }
                  goto LAB_00195983;
                }
                if (lStack_70 == 2) {
                  if (optr->ex_type == 0xf) {
                    auVar65._0_4_ = -(uint)((int)fVar18 == 0);
                    auVar65._4_4_ = -(uint)((int)fVar18 == 0);
                    auVar65._8_4_ = -(uint)((int)(float)local_58.v_int == 0);
                    auVar65._12_4_ = -(uint)((int)(float)local_58.v_int == 0);
                    iVar3 = movmskpd((int)(lStack_70 - 0xeU),auVar65);
                    if (iVar3 == 3) {
                      tVar19 = 0.0;
                    }
                    else {
                      tVar19 = 1.0;
                    }
                    iVar3 = expr->exp_vsize;
                    if (0 < (long)iVar3) {
                      ptVar6 = (optr->ex_cont).v_vec;
                      lVar10 = (long)iVar3 + -1;
                      auVar91._8_4_ = (int)lVar10;
                      auVar91._0_8_ = lVar10;
                      auVar91._12_4_ = (int)((ulong)lVar10 >> 0x20);
                      uVar12 = 0;
                      auVar91 = auVar91 ^ _DAT_001b53a0;
                      do {
                        auVar173._8_4_ = (int)uVar12;
                        auVar173._0_8_ = uVar12;
                        auVar173._12_4_ = (int)(uVar12 >> 0x20);
                        auVar25 = (auVar173 | auVar88) ^ auVar2;
                        iVar14 = auVar91._4_4_;
                        if ((bool)(~(auVar25._4_4_ == iVar14 && auVar91._0_4_ < auVar25._0_4_ ||
                                    iVar14 < auVar25._4_4_) & 1)) {
                          ptVar6[uVar12] = tVar19;
                        }
                        if ((auVar25._12_4_ != auVar91._12_4_ || auVar25._8_4_ <= auVar91._8_4_) &&
                            auVar25._12_4_ <= auVar91._12_4_) {
                          ptVar6[uVar12 + 1] = tVar19;
                        }
                        auVar25 = (auVar173 | auVar87) ^ auVar2;
                        iVar189 = auVar25._4_4_;
                        if (iVar189 <= iVar14 &&
                            (iVar189 != iVar14 || auVar25._0_4_ <= auVar91._0_4_)) {
                          ptVar6[uVar12 + 2] = tVar19;
                          ptVar6[uVar12 + 3] = tVar19;
                        }
                        uVar12 = uVar12 + 4;
                      } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                    }
                    goto LAB_00195983;
                  }
                  optr->ex_type = 2;
                  uVar9 = (float)local_58.v_int;
                  goto LAB_00199ba3;
                }
                if (lStack_70 == 1) {
                  if (optr->ex_type == 0xf) {
                    if (fVar18 == 0.0 && local_58.v_flt == 0.0) {
                      tVar19 = 0.0;
                    }
                    else {
                      tVar19 = 1.0;
                    }
                    iVar3 = expr->exp_vsize;
                    if (0 < (long)iVar3) {
                      ptVar6 = (optr->ex_cont).v_vec;
                      lVar10 = (long)iVar3 + -1;
                      auVar89._8_4_ = (int)lVar10;
                      auVar89._0_8_ = lVar10;
                      auVar89._12_4_ = (int)((ulong)lVar10 >> 0x20);
                      uVar12 = 0;
                      auVar89 = auVar89 ^ _DAT_001b53a0;
                      do {
                        auVar171._8_4_ = (int)uVar12;
                        auVar171._0_8_ = uVar12;
                        auVar171._12_4_ = (int)(uVar12 >> 0x20);
                        auVar25 = (auVar171 | auVar88) ^ auVar2;
                        iVar14 = auVar89._4_4_;
                        if ((bool)(~(auVar25._4_4_ == iVar14 && auVar89._0_4_ < auVar25._0_4_ ||
                                    iVar14 < auVar25._4_4_) & 1)) {
                          ptVar6[uVar12] = tVar19;
                        }
                        if ((auVar25._12_4_ != auVar89._12_4_ || auVar25._8_4_ <= auVar89._8_4_) &&
                            auVar25._12_4_ <= auVar89._12_4_) {
                          ptVar6[uVar12 + 1] = tVar19;
                        }
                        auVar25 = (auVar171 | auVar87) ^ auVar2;
                        iVar189 = auVar25._4_4_;
                        if (iVar189 <= iVar14 &&
                            (iVar189 != iVar14 || auVar25._0_4_ <= auVar89._0_4_)) {
                          ptVar6[uVar12 + 2] = tVar19;
                          ptVar6[uVar12 + 3] = tVar19;
                        }
                        uVar12 = uVar12 + 4;
                      } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                    }
                    goto LAB_00195983;
                  }
                  optr->ex_type = 1;
                  bVar17 = fVar18 == 0.0 && local_58.v_flt == 0.0;
LAB_00199f4b:
                  aVar11.v_int._1_7_ = 0;
                  aVar11.v_int._0_1_ = !bVar17;
                  goto LAB_00199f4e;
                }
                goto LAB_001958a1;
              }
              pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
            }
            uVar16 = 0x4e4;
            goto LAB_0019597c;
          }
          if (lVar10 != 0x50004) {
LAB_001931eb:
            uVar12 = (ulong)(uint)(peVar5->ex_cont).v_flt;
            pcVar15 = "expr: ex_print: bad op 0x%x\n";
LAB_0019141e:
            pd_error(expr,pcVar15,uVar12);
            return (ex_ex *)0x0;
          }
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
          auVar2 = _DAT_001b53a0;
          auVar88 = _DAT_001b5390;
          auVar87 = _DAT_001b5380;
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar6 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) {
LAB_0019b5f5:
                uVar16 = 0x4e2;
                goto LAB_0019b671;
              }
              optr->ex_type = 0xf;
              ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar6;
            }
            if (lStack_70 - 0xeU < 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  if (((int)local_58.v_vec[lVar10] == 0) ||
                     (tVar19 = 1.0, (int)local_78.v_vec[lVar10] == 0)) {
                    tVar19 = 0.0;
                  }
                  ptVar6[lVar10] = tVar19;
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (float)((int)local_58.v_vec[lVar10] != 0 && (int)local_78.v_flt != 0);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 1) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (float)((int)local_58.v_vec[lVar10] != 0 && (int)(float)local_78.v_int != 0);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
LAB_001958cd:
            pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar5 = (ex_ex *)0x0;
          }
          else {
            fVar18 = local_78.v_flt;
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_0019b5f5;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = 0;
                  do {
                    if (((int)local_58.v_flt == 0) ||
                       (tVar19 = 1.0, (int)local_78.v_vec[lVar10] == 0)) {
                      tVar19 = 0.0;
                    }
                    ptVar6[lVar10] = tVar19;
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  auVar71._0_4_ = -(uint)((int)fVar18 == 0);
                  auVar71._4_4_ = -(uint)((int)fVar18 == 0);
                  auVar71._8_4_ = -(uint)((int)local_58.v_flt == 0);
                  auVar71._12_4_ = -(uint)((int)local_58.v_flt == 0);
                  iVar3 = movmskpd((int)(lStack_70 - 0xeU),auVar71);
                  if (iVar3 == 0) {
                    tVar19 = 1.0;
                  }
                  else {
                    tVar19 = 0.0;
                  }
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar94._8_4_ = (int)lVar10;
                    auVar94._0_8_ = lVar10;
                    auVar94._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar94 = auVar94 ^ _DAT_001b53a0;
                    do {
                      auVar176._8_4_ = (int)uVar12;
                      auVar176._0_8_ = uVar12;
                      auVar176._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar176 | auVar88) ^ auVar2;
                      iVar14 = auVar94._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar94._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar94._12_4_ || auVar25._8_4_ <= auVar94._8_4_) &&
                          auVar25._12_4_ <= auVar94._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar176 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar94._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = local_58.v_flt;
LAB_00199ca3:
                auVar88._0_4_ = -(uint)((int)fVar18 == 0);
                auVar88._4_4_ = -(uint)((int)fVar18 == 0);
                auVar88._8_4_ = -(uint)((int)(float)uVar9 == 0);
                auVar88._12_4_ = -(uint)((int)(float)uVar9 == 0);
                iVar3 = movmskpd((int)lStack_70 + -0xe,auVar88);
                if (iVar3 == 0) goto LAB_00199cbf;
LAB_00199bbc:
                tVar19 = 0.0;
                goto LAB_00199fc9;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    fVar18 = (float)((int)local_58.v_flt != 0 && fVar18 != 0.0);
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar45._8_4_ = (int)lVar10;
                    auVar45._0_8_ = lVar10;
                    auVar45._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar45 = auVar45 ^ _DAT_001b53a0;
                    do {
                      auVar133._8_4_ = (int)uVar12;
                      auVar133._0_8_ = uVar12;
                      auVar133._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar133 | auVar88) ^ auVar2;
                      iVar14 = auVar45._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar45._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = fVar18;
                      }
                      if ((auVar25._12_4_ != auVar45._12_4_ || auVar25._8_4_ <= auVar45._8_4_) &&
                          auVar25._12_4_ <= auVar45._12_4_) {
                        ptVar6[uVar12 + 1] = fVar18;
                      }
                      auVar25 = (auVar133 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar45._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = fVar18;
                        ptVar6[uVar12 + 3] = fVar18;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar4 = (uint)(fVar18 != 0.0 && (int)local_58.v_flt != 0);
                goto LAB_00199d0d;
              }
              goto LAB_001958cd;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_0019b5f5;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = 0;
                  do {
                    if (((int)(float)local_58.v_int == 0) ||
                       (tVar19 = 1.0, (int)local_78.v_vec[lVar10] == 0)) {
                      tVar19 = 0.0;
                    }
                    ptVar6[lVar10] = tVar19;
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  auVar69._0_4_ = -(uint)((int)fVar18 == 0);
                  auVar69._4_4_ = -(uint)((int)fVar18 == 0);
                  auVar69._8_4_ = -(uint)((int)(float)local_58.v_int == 0);
                  auVar69._12_4_ = -(uint)((int)(float)local_58.v_int == 0);
                  iVar3 = movmskpd((int)(lStack_70 - 0xeU),auVar69);
                  if (iVar3 == 0) {
                    tVar19 = 1.0;
                  }
                  else {
                    tVar19 = 0.0;
                  }
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar93._8_4_ = (int)lVar10;
                    auVar93._0_8_ = lVar10;
                    auVar93._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar93 = auVar93 ^ _DAT_001b53a0;
                    do {
                      auVar175._8_4_ = (int)uVar12;
                      auVar175._0_8_ = uVar12;
                      auVar175._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar175 | auVar88) ^ auVar2;
                      iVar14 = auVar93._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar93._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar93._12_4_ || auVar25._8_4_ <= auVar93._8_4_) &&
                          auVar25._12_4_ <= auVar93._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar175 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar93._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = (float)local_58.v_int;
                goto LAB_00199ca3;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    fVar18 = (float)(local_58.v_flt != 0.0 && fVar18 != 0.0);
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar24._8_4_ = (int)lVar10;
                    auVar24._0_8_ = lVar10;
                    auVar24._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar24 = auVar24 ^ _DAT_001b53a0;
                    do {
                      auVar111._8_4_ = (int)uVar12;
                      auVar111._0_8_ = uVar12;
                      auVar111._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar111 | auVar88) ^ auVar2;
                      iVar14 = auVar24._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar24._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = fVar18;
                      }
                      if ((auVar25._12_4_ != auVar24._12_4_ || auVar25._8_4_ <= auVar24._8_4_) &&
                          auVar25._12_4_ <= auVar24._12_4_) {
                        ptVar6[uVar12 + 1] = fVar18;
                      }
                      auVar25 = (auVar111 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar24._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = fVar18;
                        ptVar6[uVar12 + 3] = fVar18;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 1;
                aVar7.v_int._1_7_ = 0;
                aVar7.v_int._0_1_ = fVar18 != 0.0 && local_58.v_flt != 0.0;
                goto LAB_00199cf4;
              }
              goto LAB_001958cd;
            }
            pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar16 = 0x4e2;
          goto LAB_0019597c;
        }
        if (lVar10 != 0x60005) {
          if (lVar10 != 0x70006) {
            if (lVar10 != 0x80007) goto LAB_001931eb;
            peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
            peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
            auVar2 = _DAT_001b53a0;
            auVar88 = _DAT_001b5390;
            auVar87 = _DAT_001b5380;
            if (lStack_50 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar6 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) {
LAB_0019b603:
                  uVar16 = 0x4dc;
                  goto LAB_0019b671;
                }
                optr->ex_type = 0xf;
                ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar6;
              }
              if (lStack_70 - 0xeU < 2) {
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (float)((int)local_78.v_vec[lVar10] & (int)local_58.v_vec[lVar10]);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] = (float)((int)local_58.v_vec[lVar10] & (int)local_78.v_flt);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 1) {
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (float)((int)local_58.v_vec[lVar10] & (int)(float)local_78.v_int);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
LAB_001958e3:
              pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
              peVar5 = (ex_ex *)0x0;
            }
            else {
              if (lStack_50 == 2) {
                if (lStack_70 - 0xeU < 2) {
                  if (optr->ex_type != 0xf) {
                    if (optr->ex_type == 0xe) goto LAB_0019b603;
                    optr->ex_type = 0xf;
                    ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                    (optr->ex_cont).v_vec = ptVar6;
                  }
                  iVar3 = expr->exp_vsize;
                  if (0 < iVar3) {
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = 0;
                    do {
                      ptVar6[lVar10] = (float)((int)local_78.v_vec[lVar10] & (int)local_58.v_flt);
                      lVar10 = lVar10 + 1;
                    } while (iVar3 != (int)lVar10);
                  }
                  goto LAB_00195983;
                }
                if (lStack_70 == 2) {
                  if (optr->ex_type == 0xf) {
                    iVar3 = expr->exp_vsize;
                    if (0 < (long)iVar3) {
                      fVar18 = (float)((int)local_78.v_flt & (int)local_58.v_flt);
                      ptVar6 = (optr->ex_cont).v_vec;
                      lVar10 = (long)iVar3 + -1;
                      auVar72._8_4_ = (int)lVar10;
                      auVar72._0_8_ = lVar10;
                      auVar72._12_4_ = (int)((ulong)lVar10 >> 0x20);
                      uVar12 = 0;
                      auVar72 = auVar72 ^ _DAT_001b53a0;
                      do {
                        auVar156._8_4_ = (int)uVar12;
                        auVar156._0_8_ = uVar12;
                        auVar156._12_4_ = (int)(uVar12 >> 0x20);
                        auVar25 = (auVar156 | auVar88) ^ auVar2;
                        iVar14 = auVar72._4_4_;
                        if ((bool)(~(auVar25._4_4_ == iVar14 && auVar72._0_4_ < auVar25._0_4_ ||
                                    iVar14 < auVar25._4_4_) & 1)) {
                          ptVar6[uVar12] = fVar18;
                        }
                        if ((auVar25._12_4_ != auVar72._12_4_ || auVar25._8_4_ <= auVar72._8_4_) &&
                            auVar25._12_4_ <= auVar72._12_4_) {
                          ptVar6[uVar12 + 1] = fVar18;
                        }
                        auVar25 = (auVar156 | auVar87) ^ auVar2;
                        iVar189 = auVar25._4_4_;
                        if (iVar189 <= iVar14 &&
                            (iVar189 != iVar14 || auVar25._0_4_ <= auVar72._0_4_)) {
                          ptVar6[uVar12 + 2] = fVar18;
                          ptVar6[uVar12 + 3] = fVar18;
                        }
                        uVar12 = uVar12 + 4;
                      } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                    }
                    goto LAB_00195983;
                  }
                  optr->ex_type = 2;
                  uVar9 = local_58.v_flt;
LAB_00199cda:
                  uVar4 = (int)local_78.v_flt & (int)(float)uVar9;
                  goto LAB_00199d46;
                }
                if (lStack_70 == 1) {
                  if (optr->ex_type == 0xf) {
                    iVar3 = expr->exp_vsize;
                    if (0 < (long)iVar3) {
                      fVar18 = (float)(int)((int)local_58.v_flt & (uint)local_78.v_flt);
                      ptVar6 = (optr->ex_cont).v_vec;
                      lVar10 = (long)iVar3 + -1;
                      auVar46._8_4_ = (int)lVar10;
                      auVar46._0_8_ = lVar10;
                      auVar46._12_4_ = (int)((ulong)lVar10 >> 0x20);
                      uVar12 = 0;
                      auVar46 = auVar46 ^ _DAT_001b53a0;
                      do {
                        auVar134._8_4_ = (int)uVar12;
                        auVar134._0_8_ = uVar12;
                        auVar134._12_4_ = (int)(uVar12 >> 0x20);
                        auVar25 = (auVar134 | auVar88) ^ auVar2;
                        iVar14 = auVar46._4_4_;
                        if ((bool)(~(auVar25._4_4_ == iVar14 && auVar46._0_4_ < auVar25._0_4_ ||
                                    iVar14 < auVar25._4_4_) & 1)) {
                          ptVar6[uVar12] = fVar18;
                        }
                        if ((auVar25._12_4_ != auVar46._12_4_ || auVar25._8_4_ <= auVar46._8_4_) &&
                            auVar25._12_4_ <= auVar46._12_4_) {
                          ptVar6[uVar12 + 1] = fVar18;
                        }
                        auVar25 = (auVar134 | auVar87) ^ auVar2;
                        iVar189 = auVar25._4_4_;
                        if (iVar189 <= iVar14 &&
                            (iVar189 != iVar14 || auVar25._0_4_ <= auVar46._0_4_)) {
                          ptVar6[uVar12 + 2] = fVar18;
                          ptVar6[uVar12 + 3] = fVar18;
                        }
                        uVar12 = uVar12 + 4;
                      } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                    }
                    goto LAB_00195983;
                  }
                  optr->ex_type = 2;
                  uVar4 = (int)local_58.v_flt & (uint)local_78.v_flt;
                  goto LAB_00199d0d;
                }
                goto LAB_001958e3;
              }
              if (lStack_50 == 1) {
                if (lStack_70 - 0xeU < 2) {
                  if (optr->ex_type != 0xf) {
                    if (optr->ex_type == 0xe) goto LAB_0019b603;
                    optr->ex_type = 0xf;
                    ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                    (optr->ex_cont).v_vec = ptVar6;
                  }
                  iVar3 = expr->exp_vsize;
                  if (0 < iVar3) {
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = 0;
                    do {
                      ptVar6[lVar10] =
                           (float)((int)local_78.v_vec[lVar10] & (int)(float)local_58.v_int);
                      lVar10 = lVar10 + 1;
                    } while (iVar3 != (int)lVar10);
                  }
                  goto LAB_00195983;
                }
                if (lStack_70 == 2) {
                  if (optr->ex_type == 0xf) {
                    iVar3 = expr->exp_vsize;
                    if (0 < (long)iVar3) {
                      fVar18 = (float)((int)local_78.v_flt & (int)(float)local_58.v_int);
                      ptVar6 = (optr->ex_cont).v_vec;
                      lVar10 = (long)iVar3 + -1;
                      auVar70._8_4_ = (int)lVar10;
                      auVar70._0_8_ = lVar10;
                      auVar70._12_4_ = (int)((ulong)lVar10 >> 0x20);
                      uVar12 = 0;
                      auVar70 = auVar70 ^ _DAT_001b53a0;
                      do {
                        auVar155._8_4_ = (int)uVar12;
                        auVar155._0_8_ = uVar12;
                        auVar155._12_4_ = (int)(uVar12 >> 0x20);
                        auVar25 = (auVar155 | auVar88) ^ auVar2;
                        iVar14 = auVar70._4_4_;
                        if ((bool)(~(auVar25._4_4_ == iVar14 && auVar70._0_4_ < auVar25._0_4_ ||
                                    iVar14 < auVar25._4_4_) & 1)) {
                          ptVar6[uVar12] = fVar18;
                        }
                        if ((auVar25._12_4_ != auVar70._12_4_ || auVar25._8_4_ <= auVar70._8_4_) &&
                            auVar25._12_4_ <= auVar70._12_4_) {
                          ptVar6[uVar12 + 1] = fVar18;
                        }
                        auVar25 = (auVar155 | auVar87) ^ auVar2;
                        iVar189 = auVar25._4_4_;
                        if (iVar189 <= iVar14 &&
                            (iVar189 != iVar14 || auVar25._0_4_ <= auVar70._0_4_)) {
                          ptVar6[uVar12 + 2] = fVar18;
                          ptVar6[uVar12 + 3] = fVar18;
                        }
                        uVar12 = uVar12 + 4;
                      } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                    }
                    goto LAB_00195983;
                  }
                  optr->ex_type = 2;
                  uVar9 = (float)local_58.v_int;
                  goto LAB_00199cda;
                }
                if (lStack_70 == 1) {
                  if (optr->ex_type == 0xf) {
                    iVar3 = expr->exp_vsize;
                    if (0 < (long)iVar3) {
                      fVar18 = (float)(int)((uint)local_78.v_flt & (uint)local_58.v_flt);
                      ptVar6 = (optr->ex_cont).v_vec;
                      lVar10 = (long)iVar3 + -1;
                      auVar26._8_4_ = (int)lVar10;
                      auVar26._0_8_ = lVar10;
                      auVar26._12_4_ = (int)((ulong)lVar10 >> 0x20);
                      uVar12 = 0;
                      auVar26 = auVar26 ^ _DAT_001b53a0;
                      do {
                        auVar114._8_4_ = (int)uVar12;
                        auVar114._0_8_ = uVar12;
                        auVar114._12_4_ = (int)(uVar12 >> 0x20);
                        auVar25 = (auVar114 | auVar88) ^ auVar2;
                        iVar14 = auVar26._4_4_;
                        if ((bool)(~(auVar25._4_4_ == iVar14 && auVar26._0_4_ < auVar25._0_4_ ||
                                    iVar14 < auVar25._4_4_) & 1)) {
                          ptVar6[uVar12] = fVar18;
                        }
                        if ((auVar25._12_4_ != auVar26._12_4_ || auVar25._8_4_ <= auVar26._8_4_) &&
                            auVar25._12_4_ <= auVar26._12_4_) {
                          ptVar6[uVar12 + 1] = fVar18;
                        }
                        auVar25 = (auVar114 | auVar87) ^ auVar2;
                        iVar189 = auVar25._4_4_;
                        if (iVar189 <= iVar14 &&
                            (iVar189 != iVar14 || auVar25._0_4_ <= auVar26._0_4_)) {
                          ptVar6[uVar12 + 2] = fVar18;
                          ptVar6[uVar12 + 3] = fVar18;
                        }
                        uVar12 = uVar12 + 4;
                      } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                    }
                    goto LAB_00195983;
                  }
                  optr->ex_type = 1;
                  uVar4 = (uint)local_78.v_flt & (uint)local_58.v_flt;
                  goto LAB_00199cf2;
                }
                goto LAB_001958e3;
              }
              pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
            }
            uVar16 = 0x4dc;
            goto LAB_0019597c;
          }
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
          auVar2 = _DAT_001b53a0;
          auVar88 = _DAT_001b5390;
          auVar87 = _DAT_001b5380;
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar6 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) {
LAB_0019b5e7:
                uVar16 = 0x4de;
                goto LAB_0019b671;
              }
              optr->ex_type = 0xf;
              ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar6;
            }
            if (lStack_70 - 0xeU < 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (float)((int)local_78.v_vec[lVar10] ^ (int)local_58.v_vec[lVar10]);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] = (float)((int)local_58.v_vec[lVar10] ^ (int)local_78.v_flt);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 1) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] = (float)((int)local_58.v_vec[lVar10] ^ (int)(float)local_78.v_int)
                  ;
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
LAB_001958b7:
            pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar5 = (ex_ex *)0x0;
          }
          else {
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_0019b5e7;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] = (float)((int)local_78.v_vec[lVar10] ^ (int)local_58.v_flt);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    fVar18 = (float)((int)local_78.v_flt ^ (int)local_58.v_flt);
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar68._8_4_ = (int)lVar10;
                    auVar68._0_8_ = lVar10;
                    auVar68._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar68 = auVar68 ^ _DAT_001b53a0;
                    do {
                      auVar154._8_4_ = (int)uVar12;
                      auVar154._0_8_ = uVar12;
                      auVar154._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar154 | auVar88) ^ auVar2;
                      iVar14 = auVar68._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar68._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = fVar18;
                      }
                      if ((auVar25._12_4_ != auVar68._12_4_ || auVar25._8_4_ <= auVar68._8_4_) &&
                          auVar25._12_4_ <= auVar68._12_4_) {
                        ptVar6[uVar12 + 1] = fVar18;
                      }
                      auVar25 = (auVar154 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar68._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = fVar18;
                        ptVar6[uVar12 + 3] = fVar18;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = local_58.v_flt;
LAB_00199bd2:
                uVar4 = (int)local_78.v_flt ^ (int)(float)uVar9;
                goto LAB_00199d46;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    fVar18 = (float)(int)((int)local_58.v_flt ^ (uint)local_78.v_flt);
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar44._8_4_ = (int)lVar10;
                    auVar44._0_8_ = lVar10;
                    auVar44._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar44 = auVar44 ^ _DAT_001b53a0;
                    do {
                      auVar132._8_4_ = (int)uVar12;
                      auVar132._0_8_ = uVar12;
                      auVar132._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar132 | auVar88) ^ auVar2;
                      iVar14 = auVar44._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar44._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = fVar18;
                      }
                      if ((auVar25._12_4_ != auVar44._12_4_ || auVar25._8_4_ <= auVar44._8_4_) &&
                          auVar25._12_4_ <= auVar44._12_4_) {
                        ptVar6[uVar12 + 1] = fVar18;
                      }
                      auVar25 = (auVar132 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar44._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = fVar18;
                        ptVar6[uVar12 + 3] = fVar18;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar4 = (int)local_58.v_flt ^ (uint)local_78.v_flt;
                goto LAB_00199d0d;
              }
              goto LAB_001958b7;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_0019b5e7;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (float)((int)local_78.v_vec[lVar10] ^ (int)(float)local_58.v_int);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    fVar18 = (float)((int)local_78.v_flt ^ (int)(float)local_58.v_int);
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar66._8_4_ = (int)lVar10;
                    auVar66._0_8_ = lVar10;
                    auVar66._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar66 = auVar66 ^ _DAT_001b53a0;
                    do {
                      auVar153._8_4_ = (int)uVar12;
                      auVar153._0_8_ = uVar12;
                      auVar153._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar153 | auVar88) ^ auVar2;
                      iVar14 = auVar66._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar66._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = fVar18;
                      }
                      if ((auVar25._12_4_ != auVar66._12_4_ || auVar25._8_4_ <= auVar66._8_4_) &&
                          auVar25._12_4_ <= auVar66._12_4_) {
                        ptVar6[uVar12 + 1] = fVar18;
                      }
                      auVar25 = (auVar153 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar66._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = fVar18;
                        ptVar6[uVar12 + 3] = fVar18;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = (float)local_58.v_int;
                goto LAB_00199bd2;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    fVar18 = (float)(int)((uint)local_78.v_flt ^ (uint)local_58.v_flt);
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar34._8_4_ = (int)lVar10;
                    auVar34._0_8_ = lVar10;
                    auVar34._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar34 = auVar34 ^ _DAT_001b53a0;
                    do {
                      auVar122._8_4_ = (int)uVar12;
                      auVar122._0_8_ = uVar12;
                      auVar122._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar122 | auVar88) ^ auVar2;
                      iVar14 = auVar34._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar34._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = fVar18;
                      }
                      if ((auVar25._12_4_ != auVar34._12_4_ || auVar25._8_4_ <= auVar34._8_4_) &&
                          auVar25._12_4_ <= auVar34._12_4_) {
                        ptVar6[uVar12 + 1] = fVar18;
                      }
                      auVar25 = (auVar122 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar34._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = fVar18;
                        ptVar6[uVar12 + 3] = fVar18;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 1;
                uVar4 = (uint)local_78.v_flt ^ (uint)local_58.v_flt;
                goto LAB_00199cf2;
              }
              goto LAB_001958b7;
            }
            pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar16 = 0x4de;
          goto LAB_0019597c;
        }
        peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
        peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
        auVar2 = _DAT_001b53a0;
        auVar88 = _DAT_001b5390;
        auVar87 = _DAT_001b5380;
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar6 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0019b611:
              uVar16 = 0x4e0;
              goto LAB_0019b671;
            }
            optr->ex_type = 0xf;
            ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar6;
          }
          if (lStack_70 - 0xeU < 2) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                ptVar6[lVar10] = (float)((int)local_78.v_vec[lVar10] | (int)local_58.v_vec[lVar10]);
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
            goto LAB_00195983;
          }
          if (lStack_70 == 2) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                ptVar6[lVar10] = (float)((int)local_58.v_vec[lVar10] | (int)local_78.v_flt);
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
            goto LAB_00195983;
          }
          if (lStack_70 == 1) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                ptVar6[lVar10] = (float)((int)local_58.v_vec[lVar10] | (int)(float)local_78.v_int);
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
            goto LAB_00195983;
          }
LAB_001958f9:
          pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar5 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) goto LAB_0019b611;
                optr->ex_type = 0xf;
                ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar6;
              }
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                ptVar6 = (optr->ex_cont).v_vec;
                lVar10 = 0;
                do {
                  ptVar6[lVar10] = (float)((int)local_78.v_vec[lVar10] | (int)local_58.v_flt);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)((int)local_78.v_flt | (int)local_58.v_flt);
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar74._8_4_ = (int)lVar10;
                  auVar74._0_8_ = lVar10;
                  auVar74._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar74 = auVar74 ^ _DAT_001b53a0;
                  do {
                    auVar158._8_4_ = (int)uVar12;
                    auVar158._0_8_ = uVar12;
                    auVar158._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar158 | auVar88) ^ auVar2;
                    iVar14 = auVar74._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar74._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar74._12_4_ || auVar25._8_4_ <= auVar74._8_4_) &&
                        auVar25._12_4_ <= auVar74._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar158 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar74._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              uVar9 = local_58.v_flt;
LAB_00199d3f:
              uVar4 = (int)local_78.v_flt | (int)(float)uVar9;
LAB_00199d46:
              tVar19 = (float)(int)uVar4;
              goto LAB_00199fc9;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)(int)((int)local_58.v_flt | (uint)local_78.v_flt);
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar47._8_4_ = (int)lVar10;
                  auVar47._0_8_ = lVar10;
                  auVar47._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar47 = auVar47 ^ _DAT_001b53a0;
                  do {
                    auVar135._8_4_ = (int)uVar12;
                    auVar135._0_8_ = uVar12;
                    auVar135._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar135 | auVar88) ^ auVar2;
                    iVar14 = auVar47._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar47._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar47._12_4_ || auVar25._8_4_ <= auVar47._8_4_) &&
                        auVar25._12_4_ <= auVar47._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar135 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar47._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              uVar4 = (int)local_58.v_flt | (uint)local_78.v_flt;
              goto LAB_00199d0d;
            }
            goto LAB_001958f9;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) goto LAB_0019b611;
                optr->ex_type = 0xf;
                ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar6;
              }
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                ptVar6 = (optr->ex_cont).v_vec;
                lVar10 = 0;
                do {
                  ptVar6[lVar10] = (float)((int)local_78.v_vec[lVar10] | (int)(float)local_58.v_int)
                  ;
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)((int)local_78.v_flt | (int)(float)local_58.v_int);
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar73._8_4_ = (int)lVar10;
                  auVar73._0_8_ = lVar10;
                  auVar73._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar73 = auVar73 ^ _DAT_001b53a0;
                  do {
                    auVar157._8_4_ = (int)uVar12;
                    auVar157._0_8_ = uVar12;
                    auVar157._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar157 | auVar88) ^ auVar2;
                    iVar14 = auVar73._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar73._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar73._12_4_ || auVar25._8_4_ <= auVar73._8_4_) &&
                        auVar25._12_4_ <= auVar73._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar157 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar73._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              uVar9 = (float)local_58.v_int;
              goto LAB_00199d3f;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)(int)((uint)local_78.v_flt | (uint)local_58.v_flt);
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar35._8_4_ = (int)lVar10;
                  auVar35._0_8_ = lVar10;
                  auVar35._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar35 = auVar35 ^ _DAT_001b53a0;
                  do {
                    auVar123._8_4_ = (int)uVar12;
                    auVar123._0_8_ = uVar12;
                    auVar123._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar123 | auVar88) ^ auVar2;
                    iVar14 = auVar35._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar35._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar35._12_4_ || auVar25._8_4_ <= auVar35._8_4_) &&
                        auVar25._12_4_ <= auVar35._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar123 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar35._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 1;
              uVar4 = (uint)local_78.v_flt | (uint)local_58.v_flt;
LAB_00199cf2:
              aVar7 = (anon_union_8_5_735de1bb_for_ex_cont)(long)(int)uVar4;
              goto LAB_00199cf4;
            }
            goto LAB_001958f9;
          }
          pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar16 = 0x4e0;
      }
      else {
        switch(lVar10) {
        case 0xa000a:
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
          auVar2 = _DAT_001b53a0;
          auVar88 = _DAT_001b5390;
          auVar87 = _DAT_001b5380;
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar6 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) {
LAB_0019b649:
                uVar16 = 0x4cd;
LAB_0019b671:
                post("expr~: Int. error %d",uVar16);
                abort();
              }
              optr->ex_type = 0xf;
              ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar6;
            }
            if (lStack_70 - 0xeU < 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (t_float)(-(uint)(local_78.v_vec[lVar10] <= local_58.v_vec[lVar10]) &
                                0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (t_float)(-(uint)(local_78.v_flt <= local_58.v_vec[lVar10]) & 0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 1) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (t_float)(-(uint)((float)local_78.v_int <= local_58.v_vec[lVar10]) &
                                0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
LAB_00195945:
            pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar5 = (ex_ex *)0x0;
          }
          else {
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type == 0xf) {
                  ptVar6 = (optr->ex_cont).v_vec;
                }
                else {
                  if (optr->ex_type == 0xe) goto LAB_0019b649;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (t_float)(-(uint)(local_78.v_vec[lVar10] <= local_58.v_flt) & 0x3f800000);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    tVar19 = (t_float)(-(uint)(local_78.v_flt <= local_58.v_flt) & 0x3f800000);
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar83._8_4_ = (int)lVar10;
                    auVar83._0_8_ = lVar10;
                    auVar83._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar83 = auVar83 ^ _DAT_001b53a0;
                    do {
                      auVar167._8_4_ = (int)uVar12;
                      auVar167._0_8_ = uVar12;
                      auVar167._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar167 | auVar88) ^ auVar2;
                      iVar14 = auVar83._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar83._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar83._12_4_ || auVar25._8_4_ <= auVar83._8_4_) &&
                          auVar25._12_4_ <= auVar83._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar167 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar83._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = local_78.v_flt;
              }
              else {
                if (lStack_70 != 1) goto LAB_00195945;
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    tVar19 = (t_float)(-(uint)((float)local_78.v_int <= local_58.v_flt) & 0x3f800000
                                      );
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar51._8_4_ = (int)lVar10;
                    auVar51._0_8_ = lVar10;
                    auVar51._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar51 = auVar51 ^ _DAT_001b53a0;
                    do {
                      auVar139._8_4_ = (int)uVar12;
                      auVar139._0_8_ = uVar12;
                      auVar139._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar139 | auVar88) ^ auVar2;
                      iVar14 = auVar51._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar51._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar51._12_4_ || auVar25._8_4_ <= auVar51._8_4_) &&
                          auVar25._12_4_ <= auVar51._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar139 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar51._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = (float)local_78.v_int;
              }
              uVar4 = -(uint)((float)uVar9 <= local_58.v_flt);
LAB_00199f97:
              tVar19 = (t_float)(uVar4 & 0x3f800000);
LAB_00199fa2:
              (optr->ex_cont).v_flt = tVar19;
              goto LAB_00195983;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type == 0xf) {
                  ptVar6 = (optr->ex_cont).v_vec;
                }
                else {
                  if (optr->ex_type == 0xe) goto LAB_0019b649;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (t_float)(-(uint)(local_78.v_vec[lVar10] <= (float)local_58.v_int) &
                                  0x3f800000);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    tVar19 = (t_float)(-(uint)(local_78.v_flt <= (float)local_58.v_int) & 0x3f800000
                                      );
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar81._8_4_ = (int)lVar10;
                    auVar81._0_8_ = lVar10;
                    auVar81._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar81 = auVar81 ^ _DAT_001b53a0;
                    do {
                      auVar165._8_4_ = (int)uVar12;
                      auVar165._0_8_ = uVar12;
                      auVar165._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar165 | auVar88) ^ auVar2;
                      iVar14 = auVar81._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar81._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar81._12_4_ || auVar25._8_4_ <= auVar81._8_4_) &&
                          auVar25._12_4_ <= auVar81._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar165 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar81._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                bVar17 = local_78.v_flt <= (float)local_58.v_int;
LAB_00199efc:
                tVar19 = (t_float)(-(uint)bVar17 & 0x3f800000);
                goto LAB_00199fc9;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  if (local_58.v_int < local_78.v_int) {
                    tVar19 = 0.0;
                  }
                  else {
                    tVar19 = 1.0;
                  }
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar98._8_4_ = (int)lVar10;
                    auVar98._0_8_ = lVar10;
                    auVar98._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar98 = auVar98 ^ _DAT_001b53a0;
                    do {
                      auVar180._8_4_ = (int)uVar12;
                      auVar180._0_8_ = uVar12;
                      auVar180._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar180 | auVar88) ^ auVar2;
                      iVar14 = auVar98._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar98._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar98._12_4_ || auVar25._8_4_ <= auVar98._8_4_) &&
                          auVar25._12_4_ <= auVar98._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar180 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar98._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 1;
                aVar11.v_int._1_7_ = 0;
                aVar11.v_int._0_1_ = local_78.v_int <= local_58.v_int;
LAB_00199f4e:
                optr->ex_cont = aVar11;
                goto LAB_00195983;
              }
              goto LAB_00195945;
            }
            pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar16 = 0x4cd;
          break;
        case 0xa000b:
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
          auVar2 = _DAT_001b53a0;
          auVar88 = _DAT_001b5390;
          auVar87 = _DAT_001b5380;
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar6 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) {
LAB_0019b657:
                uVar16 = 0x4cb;
                goto LAB_0019b671;
              }
              optr->ex_type = 0xf;
              ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar6;
            }
            if (lStack_70 - 0xeU < 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (t_float)(-(uint)(local_78.v_vec[lVar10] < local_58.v_vec[lVar10]) &
                                0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (t_float)(-(uint)(local_78.v_flt < local_58.v_vec[lVar10]) & 0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 1) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (t_float)(-(uint)((float)local_78.v_int < local_58.v_vec[lVar10]) &
                                0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
LAB_00195958:
            pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar5 = (ex_ex *)0x0;
          }
          else {
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type == 0xf) {
                  ptVar6 = (optr->ex_cont).v_vec;
                }
                else {
                  if (optr->ex_type == 0xe) goto LAB_0019b657;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (t_float)(-(uint)(local_78.v_vec[lVar10] < local_58.v_flt) & 0x3f800000);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    tVar19 = (t_float)(-(uint)(local_78.v_flt < local_58.v_flt) & 0x3f800000);
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar84._8_4_ = (int)lVar10;
                    auVar84._0_8_ = lVar10;
                    auVar84._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar84 = auVar84 ^ _DAT_001b53a0;
                    do {
                      auVar168._8_4_ = (int)uVar12;
                      auVar168._0_8_ = uVar12;
                      auVar168._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar168 | auVar88) ^ auVar2;
                      iVar14 = auVar84._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar84._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar84._12_4_ || auVar25._8_4_ <= auVar84._8_4_) &&
                          auVar25._12_4_ <= auVar84._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar168 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar84._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = local_78.v_flt;
              }
              else {
                if (lStack_70 != 1) goto LAB_00195958;
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    tVar19 = (t_float)(-(uint)((float)local_78.v_int < local_58.v_flt) & 0x3f800000)
                    ;
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar52._8_4_ = (int)lVar10;
                    auVar52._0_8_ = lVar10;
                    auVar52._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar52 = auVar52 ^ _DAT_001b53a0;
                    do {
                      auVar140._8_4_ = (int)uVar12;
                      auVar140._0_8_ = uVar12;
                      auVar140._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar140 | auVar88) ^ auVar2;
                      iVar14 = auVar52._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar52._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar52._12_4_ || auVar25._8_4_ <= auVar52._8_4_) &&
                          auVar25._12_4_ <= auVar52._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar140 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar52._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = (float)local_78.v_int;
              }
              uVar4 = -(uint)((float)uVar9 < local_58.v_flt);
              goto LAB_00199f97;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type == 0xf) {
                  ptVar6 = (optr->ex_cont).v_vec;
                }
                else {
                  if (optr->ex_type == 0xe) goto LAB_0019b657;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (t_float)(-(uint)(local_78.v_vec[lVar10] < (float)local_58.v_int) &
                                  0x3f800000);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    tVar19 = (t_float)(-(uint)(local_78.v_flt < (float)local_58.v_int) & 0x3f800000)
                    ;
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar82._8_4_ = (int)lVar10;
                    auVar82._0_8_ = lVar10;
                    auVar82._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar82 = auVar82 ^ _DAT_001b53a0;
                    do {
                      auVar166._8_4_ = (int)uVar12;
                      auVar166._0_8_ = uVar12;
                      auVar166._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar166 | auVar88) ^ auVar2;
                      iVar14 = auVar82._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar82._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar82._12_4_ || auVar25._8_4_ <= auVar82._8_4_) &&
                          auVar25._12_4_ <= auVar82._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar166 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar82._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                bVar17 = local_78.v_flt < (float)local_58.v_int;
                goto LAB_00199efc;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  if (local_78.v_int < local_58.v_int) {
                    tVar19 = 1.0;
                  }
                  else {
                    tVar19 = 0.0;
                  }
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar99._8_4_ = (int)lVar10;
                    auVar99._0_8_ = lVar10;
                    auVar99._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar99 = auVar99 ^ _DAT_001b53a0;
                    do {
                      auVar181._8_4_ = (int)uVar12;
                      auVar181._0_8_ = uVar12;
                      auVar181._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar181 | auVar88) ^ auVar2;
                      iVar14 = auVar99._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar99._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar99._12_4_ || auVar25._8_4_ <= auVar99._8_4_) &&
                          auVar25._12_4_ <= auVar99._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar181 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar99._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 1;
                aVar11.v_int._1_7_ = 0;
                aVar11.v_int._0_1_ = local_78.v_int < local_58.v_int;
                goto LAB_00199f4e;
              }
              goto LAB_00195958;
            }
            pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar16 = 0x4cb;
          break;
        case 0xa000c:
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
          auVar2 = _DAT_001b53a0;
          auVar88 = _DAT_001b5390;
          auVar87 = _DAT_001b5380;
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar6 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) {
LAB_0019b61f:
                uVar16 = 0x4c9;
                goto LAB_0019b671;
              }
              optr->ex_type = 0xf;
              ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar6;
            }
            if (lStack_70 - 0xeU < 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (t_float)(-(uint)(local_58.v_vec[lVar10] <= local_78.v_vec[lVar10]) &
                                0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (t_float)(-(uint)(local_58.v_vec[lVar10] <= local_78.v_flt) & 0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 1) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (t_float)(-(uint)(local_58.v_vec[lVar10] <= (float)local_78.v_int) &
                                0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
LAB_0019590c:
            pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar5 = (ex_ex *)0x0;
          }
          else {
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type == 0xf) {
                  ptVar6 = (optr->ex_cont).v_vec;
                }
                else {
                  if (optr->ex_type == 0xe) goto LAB_0019b61f;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (t_float)(-(uint)(local_58.v_flt <= local_78.v_vec[lVar10]) & 0x3f800000);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    tVar19 = (t_float)(-(uint)(local_58.v_flt <= local_78.v_flt) & 0x3f800000);
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar76._8_4_ = (int)lVar10;
                    auVar76._0_8_ = lVar10;
                    auVar76._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar76 = auVar76 ^ _DAT_001b53a0;
                    do {
                      auVar160._8_4_ = (int)uVar12;
                      auVar160._0_8_ = uVar12;
                      auVar160._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar160 | auVar88) ^ auVar2;
                      iVar14 = auVar76._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar76._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar76._12_4_ || auVar25._8_4_ <= auVar76._8_4_) &&
                          auVar25._12_4_ <= auVar76._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar160 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar76._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = local_58.v_flt;
LAB_00199daa:
                uVar4 = -(uint)((float)uVar9 <= local_78.v_flt);
                goto LAB_00199f97;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    tVar19 = (t_float)(-(uint)(local_58.v_flt <= (float)local_78.v_int) & 0x3f800000
                                      );
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar48._8_4_ = (int)lVar10;
                    auVar48._0_8_ = lVar10;
                    auVar48._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar48 = auVar48 ^ _DAT_001b53a0;
                    do {
                      auVar136._8_4_ = (int)uVar12;
                      auVar136._0_8_ = uVar12;
                      auVar136._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar136 | auVar88) ^ auVar2;
                      iVar14 = auVar48._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar48._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar48._12_4_ || auVar25._8_4_ <= auVar48._8_4_) &&
                          auVar25._12_4_ <= auVar48._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar136 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar48._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar4 = -(uint)(local_58.v_flt <= (float)local_78.v_int);
                goto LAB_00199f97;
              }
              goto LAB_0019590c;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type == 0xf) {
                  ptVar6 = (optr->ex_cont).v_vec;
                }
                else {
                  if (optr->ex_type == 0xe) goto LAB_0019b61f;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (t_float)(-(uint)((float)local_58.v_int <= local_78.v_vec[lVar10]) &
                                  0x3f800000);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    tVar19 = (t_float)(-(uint)((float)local_58.v_int <= local_78.v_flt) & 0x3f800000
                                      );
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar75._8_4_ = (int)lVar10;
                    auVar75._0_8_ = lVar10;
                    auVar75._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar75 = auVar75 ^ _DAT_001b53a0;
                    do {
                      auVar159._8_4_ = (int)uVar12;
                      auVar159._0_8_ = uVar12;
                      auVar159._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar159 | auVar88) ^ auVar2;
                      iVar14 = auVar75._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar75._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar75._12_4_ || auVar25._8_4_ <= auVar75._8_4_) &&
                          auVar25._12_4_ <= auVar75._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar159 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar75._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = (float)local_58.v_int;
                goto LAB_00199daa;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  if (local_78.v_int < local_58.v_int) {
                    tVar19 = 0.0;
                  }
                  else {
                    tVar19 = 1.0;
                  }
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar95._8_4_ = (int)lVar10;
                    auVar95._0_8_ = lVar10;
                    auVar95._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar95 = auVar95 ^ _DAT_001b53a0;
                    do {
                      auVar177._8_4_ = (int)uVar12;
                      auVar177._0_8_ = uVar12;
                      auVar177._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar177 | auVar88) ^ auVar2;
                      iVar14 = auVar95._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar95._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar95._12_4_ || auVar25._8_4_ <= auVar95._8_4_) &&
                          auVar25._12_4_ <= auVar95._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar177 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar95._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 1;
                aVar11.v_int._1_7_ = 0;
                aVar11.v_int._0_1_ = local_58.v_int <= local_78.v_int;
                goto LAB_00199f4e;
              }
              goto LAB_0019590c;
            }
            pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar16 = 0x4c9;
          break;
        case 0xa000d:
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
          auVar2 = _DAT_001b53a0;
          auVar88 = _DAT_001b5390;
          auVar87 = _DAT_001b5380;
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar6 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) {
LAB_0019b63b:
                uVar16 = 0x4c7;
                goto LAB_0019b671;
              }
              optr->ex_type = 0xf;
              ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar6;
            }
            if (lStack_70 - 0xeU < 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (t_float)(-(uint)(local_58.v_vec[lVar10] < local_78.v_vec[lVar10]) &
                                0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (t_float)(-(uint)(local_58.v_vec[lVar10] < local_78.v_flt) & 0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 1) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (t_float)(-(uint)(local_58.v_vec[lVar10] < (float)local_78.v_int) &
                                0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
LAB_00195932:
            pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar5 = (ex_ex *)0x0;
          }
          else {
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type == 0xf) {
                  ptVar6 = (optr->ex_cont).v_vec;
                }
                else {
                  if (optr->ex_type == 0xe) goto LAB_0019b63b;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (t_float)(-(uint)(local_58.v_flt < local_78.v_vec[lVar10]) & 0x3f800000);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    tVar19 = (t_float)(-(uint)(local_58.v_flt < local_78.v_flt) & 0x3f800000);
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar80._8_4_ = (int)lVar10;
                    auVar80._0_8_ = lVar10;
                    auVar80._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar80 = auVar80 ^ _DAT_001b53a0;
                    do {
                      auVar164._8_4_ = (int)uVar12;
                      auVar164._0_8_ = uVar12;
                      auVar164._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar164 | auVar88) ^ auVar2;
                      iVar14 = auVar80._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar80._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar80._12_4_ || auVar25._8_4_ <= auVar80._8_4_) &&
                          auVar25._12_4_ <= auVar80._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar164 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar80._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = local_58.v_flt;
LAB_00199e67:
                uVar4 = -(uint)((float)uVar9 < local_78.v_flt);
                goto LAB_00199f97;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    tVar19 = (t_float)(-(uint)(local_58.v_flt < (float)local_78.v_int) & 0x3f800000)
                    ;
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar50._8_4_ = (int)lVar10;
                    auVar50._0_8_ = lVar10;
                    auVar50._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar50 = auVar50 ^ _DAT_001b53a0;
                    do {
                      auVar138._8_4_ = (int)uVar12;
                      auVar138._0_8_ = uVar12;
                      auVar138._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar138 | auVar88) ^ auVar2;
                      iVar14 = auVar50._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar50._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar50._12_4_ || auVar25._8_4_ <= auVar50._8_4_) &&
                          auVar25._12_4_ <= auVar50._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar138 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar50._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar4 = -(uint)(local_58.v_flt < (float)local_78.v_int);
                goto LAB_00199f97;
              }
              goto LAB_00195932;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type == 0xf) {
                  ptVar6 = (optr->ex_cont).v_vec;
                }
                else {
                  if (optr->ex_type == 0xe) goto LAB_0019b63b;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (t_float)(-(uint)((float)local_58.v_int < local_78.v_vec[lVar10]) &
                                  0x3f800000);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    tVar19 = (t_float)(-(uint)((float)local_58.v_int < local_78.v_flt) & 0x3f800000)
                    ;
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar79._8_4_ = (int)lVar10;
                    auVar79._0_8_ = lVar10;
                    auVar79._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar79 = auVar79 ^ _DAT_001b53a0;
                    do {
                      auVar163._8_4_ = (int)uVar12;
                      auVar163._0_8_ = uVar12;
                      auVar163._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar163 | auVar88) ^ auVar2;
                      iVar14 = auVar79._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar79._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar79._12_4_ || auVar25._8_4_ <= auVar79._8_4_) &&
                          auVar25._12_4_ <= auVar79._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar163 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar79._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = (float)local_58.v_int;
                goto LAB_00199e67;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  if (local_58.v_int < local_78.v_int) {
                    tVar19 = 1.0;
                  }
                  else {
                    tVar19 = 0.0;
                  }
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar97._8_4_ = (int)lVar10;
                    auVar97._0_8_ = lVar10;
                    auVar97._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar97 = auVar97 ^ _DAT_001b53a0;
                    do {
                      auVar179._8_4_ = (int)uVar12;
                      auVar179._0_8_ = uVar12;
                      auVar179._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar179 | auVar88) ^ auVar2;
                      iVar14 = auVar97._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar97._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar97._12_4_ || auVar25._8_4_ <= auVar97._8_4_) &&
                          auVar25._12_4_ <= auVar97._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar179 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar97._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 1;
                aVar11.v_int._1_7_ = 0;
                aVar11.v_int._0_1_ = local_58.v_int < local_78.v_int;
                goto LAB_00199f4e;
              }
              goto LAB_00195932;
            }
            pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar16 = 0x4c7;
          break;
        default:
          if (lVar10 != 0x90008) {
            if (lVar10 != 0x90009) goto LAB_001931eb;
            peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
            peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
            auVar2 = _DAT_001b53a0;
            auVar88 = _DAT_001b5390;
            auVar87 = _DAT_001b5380;
            if (lStack_50 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar6 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) {
LAB_0019b62d:
                  uVar16 = 0x4cf;
                  goto LAB_0019b671;
                }
                optr->ex_type = 0xf;
                ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar6;
              }
              if (lStack_70 - 0xeU < 2) {
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (t_float)(-(uint)(local_78.v_vec[lVar10] == local_58.v_vec[lVar10]) &
                                  0x3f800000);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (t_float)(-(uint)(local_58.v_vec[lVar10] == local_78.v_flt) & 0x3f800000);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 1) {
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (t_float)(-(uint)(local_58.v_vec[lVar10] == (float)local_78.v_int) &
                                  0x3f800000);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
LAB_0019591f:
              pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
              peVar5 = (ex_ex *)0x0;
            }
            else {
              if (lStack_50 == 2) {
                if (lStack_70 - 0xeU < 2) {
                  if (optr->ex_type == 0xf) {
                    ptVar6 = (optr->ex_cont).v_vec;
                  }
                  else {
                    if (optr->ex_type == 0xe) goto LAB_0019b62d;
                    optr->ex_type = 0xf;
                    ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                    (optr->ex_cont).v_vec = ptVar6;
                  }
                  iVar3 = expr->exp_vsize;
                  if (0 < iVar3) {
                    lVar10 = 0;
                    do {
                      ptVar6[lVar10] =
                           (t_float)(-(uint)(local_78.v_vec[lVar10] == local_58.v_flt) & 0x3f800000)
                      ;
                      lVar10 = lVar10 + 1;
                    } while (iVar3 != (int)lVar10);
                  }
                  goto LAB_00195983;
                }
                if (lStack_70 == 2) {
                  if (optr->ex_type == 0xf) {
                    iVar3 = expr->exp_vsize;
                    if (0 < (long)iVar3) {
                      tVar19 = (t_float)(-(uint)(local_78.v_flt == local_58.v_flt) & 0x3f800000);
                      ptVar6 = (optr->ex_cont).v_vec;
                      lVar10 = (long)iVar3 + -1;
                      auVar78._8_4_ = (int)lVar10;
                      auVar78._0_8_ = lVar10;
                      auVar78._12_4_ = (int)((ulong)lVar10 >> 0x20);
                      uVar12 = 0;
                      auVar78 = auVar78 ^ _DAT_001b53a0;
                      do {
                        auVar162._8_4_ = (int)uVar12;
                        auVar162._0_8_ = uVar12;
                        auVar162._12_4_ = (int)(uVar12 >> 0x20);
                        auVar25 = (auVar162 | auVar88) ^ auVar2;
                        iVar14 = auVar78._4_4_;
                        if ((bool)(~(auVar25._4_4_ == iVar14 && auVar78._0_4_ < auVar25._0_4_ ||
                                    iVar14 < auVar25._4_4_) & 1)) {
                          ptVar6[uVar12] = tVar19;
                        }
                        if ((auVar25._12_4_ != auVar78._12_4_ || auVar25._8_4_ <= auVar78._8_4_) &&
                            auVar25._12_4_ <= auVar78._12_4_) {
                          ptVar6[uVar12 + 1] = tVar19;
                        }
                        auVar25 = (auVar162 | auVar87) ^ auVar2;
                        iVar189 = auVar25._4_4_;
                        if (iVar189 <= iVar14 &&
                            (iVar189 != iVar14 || auVar25._0_4_ <= auVar78._0_4_)) {
                          ptVar6[uVar12 + 2] = tVar19;
                          ptVar6[uVar12 + 3] = tVar19;
                        }
                        uVar12 = uVar12 + 4;
                      } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                    }
                    goto LAB_00195983;
                  }
                  optr->ex_type = 2;
                  uVar9 = local_78.v_flt;
                }
                else {
                  if (lStack_70 != 1) goto LAB_0019591f;
                  if (optr->ex_type == 0xf) {
                    iVar3 = expr->exp_vsize;
                    if (0 < (long)iVar3) {
                      tVar19 = (t_float)(-(uint)((float)local_78.v_int == local_58.v_flt) &
                                        0x3f800000);
                      ptVar6 = (optr->ex_cont).v_vec;
                      lVar10 = (long)iVar3 + -1;
                      auVar49._8_4_ = (int)lVar10;
                      auVar49._0_8_ = lVar10;
                      auVar49._12_4_ = (int)((ulong)lVar10 >> 0x20);
                      uVar12 = 0;
                      auVar49 = auVar49 ^ _DAT_001b53a0;
                      do {
                        auVar137._8_4_ = (int)uVar12;
                        auVar137._0_8_ = uVar12;
                        auVar137._12_4_ = (int)(uVar12 >> 0x20);
                        auVar25 = (auVar137 | auVar88) ^ auVar2;
                        iVar14 = auVar49._4_4_;
                        if ((bool)(~(auVar25._4_4_ == iVar14 && auVar49._0_4_ < auVar25._0_4_ ||
                                    iVar14 < auVar25._4_4_) & 1)) {
                          ptVar6[uVar12] = tVar19;
                        }
                        if ((auVar25._12_4_ != auVar49._12_4_ || auVar25._8_4_ <= auVar49._8_4_) &&
                            auVar25._12_4_ <= auVar49._12_4_) {
                          ptVar6[uVar12 + 1] = tVar19;
                        }
                        auVar25 = (auVar137 | auVar87) ^ auVar2;
                        iVar189 = auVar25._4_4_;
                        if (iVar189 <= iVar14 &&
                            (iVar189 != iVar14 || auVar25._0_4_ <= auVar49._0_4_)) {
                          ptVar6[uVar12 + 2] = tVar19;
                          ptVar6[uVar12 + 3] = tVar19;
                        }
                        uVar12 = uVar12 + 4;
                      } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                    }
                    goto LAB_00195983;
                  }
                  optr->ex_type = 2;
                  uVar9 = (float)local_78.v_int;
                }
LAB_00195e70:
                uVar4 = -(uint)((float)uVar9 == local_58.v_flt);
                goto LAB_00199f97;
              }
              if (lStack_50 == 1) {
                if (lStack_70 - 0xeU < 2) {
                  if (optr->ex_type == 0xf) {
                    ptVar6 = (optr->ex_cont).v_vec;
                  }
                  else {
                    if (optr->ex_type == 0xe) goto LAB_0019b62d;
                    optr->ex_type = 0xf;
                    ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                    (optr->ex_cont).v_vec = ptVar6;
                  }
                  iVar3 = expr->exp_vsize;
                  if (0 < iVar3) {
                    lVar10 = 0;
                    do {
                      ptVar6[lVar10] =
                           (t_float)(-(uint)(local_78.v_vec[lVar10] == (float)local_58.v_int) &
                                    0x3f800000);
                      lVar10 = lVar10 + 1;
                    } while (iVar3 != (int)lVar10);
                  }
                  goto LAB_00195983;
                }
                if (lStack_70 == 2) {
                  if (optr->ex_type == 0xf) {
                    iVar3 = expr->exp_vsize;
                    if (0 < (long)iVar3) {
                      tVar19 = (t_float)(-(uint)((float)local_58.v_int == local_78.v_flt) &
                                        0x3f800000);
                      ptVar6 = (optr->ex_cont).v_vec;
                      lVar10 = (long)iVar3 + -1;
                      auVar77._8_4_ = (int)lVar10;
                      auVar77._0_8_ = lVar10;
                      auVar77._12_4_ = (int)((ulong)lVar10 >> 0x20);
                      uVar12 = 0;
                      auVar77 = auVar77 ^ _DAT_001b53a0;
                      do {
                        auVar161._8_4_ = (int)uVar12;
                        auVar161._0_8_ = uVar12;
                        auVar161._12_4_ = (int)(uVar12 >> 0x20);
                        auVar25 = (auVar161 | auVar88) ^ auVar2;
                        iVar14 = auVar77._4_4_;
                        if ((bool)(~(auVar25._4_4_ == iVar14 && auVar77._0_4_ < auVar25._0_4_ ||
                                    iVar14 < auVar25._4_4_) & 1)) {
                          ptVar6[uVar12] = tVar19;
                        }
                        if ((auVar25._12_4_ != auVar77._12_4_ || auVar25._8_4_ <= auVar77._8_4_) &&
                            auVar25._12_4_ <= auVar77._12_4_) {
                          ptVar6[uVar12 + 1] = tVar19;
                        }
                        auVar25 = (auVar161 | auVar87) ^ auVar2;
                        iVar189 = auVar25._4_4_;
                        if (iVar189 <= iVar14 &&
                            (iVar189 != iVar14 || auVar25._0_4_ <= auVar77._0_4_)) {
                          ptVar6[uVar12 + 2] = tVar19;
                          ptVar6[uVar12 + 3] = tVar19;
                        }
                        uVar12 = uVar12 + 4;
                      } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                    }
                    goto LAB_00195983;
                  }
                  optr->ex_type = 2;
                  uVar4 = -(uint)((float)local_58.v_int == local_78.v_flt);
                  goto LAB_00199f97;
                }
                if (lStack_70 == 1) {
                  if (optr->ex_type == 0xf) {
                    if (local_58.v_int == local_78.v_int) {
                      tVar19 = 1.0;
                    }
                    else {
                      tVar19 = 0.0;
                    }
                    iVar3 = expr->exp_vsize;
                    if (0 < (long)iVar3) {
                      ptVar6 = (optr->ex_cont).v_vec;
                      lVar10 = (long)iVar3 + -1;
                      auVar96._8_4_ = (int)lVar10;
                      auVar96._0_8_ = lVar10;
                      auVar96._12_4_ = (int)((ulong)lVar10 >> 0x20);
                      uVar12 = 0;
                      auVar96 = auVar96 ^ _DAT_001b53a0;
                      do {
                        auVar178._8_4_ = (int)uVar12;
                        auVar178._0_8_ = uVar12;
                        auVar178._12_4_ = (int)(uVar12 >> 0x20);
                        auVar25 = (auVar178 | auVar88) ^ auVar2;
                        iVar14 = auVar96._4_4_;
                        if ((bool)(~(auVar25._4_4_ == iVar14 && auVar96._0_4_ < auVar25._0_4_ ||
                                    iVar14 < auVar25._4_4_) & 1)) {
                          ptVar6[uVar12] = tVar19;
                        }
                        if ((auVar25._12_4_ != auVar96._12_4_ || auVar25._8_4_ <= auVar96._8_4_) &&
                            auVar25._12_4_ <= auVar96._12_4_) {
                          ptVar6[uVar12 + 1] = tVar19;
                        }
                        auVar25 = (auVar178 | auVar87) ^ auVar2;
                        iVar189 = auVar25._4_4_;
                        if (iVar189 <= iVar14 &&
                            (iVar189 != iVar14 || auVar25._0_4_ <= auVar96._0_4_)) {
                          ptVar6[uVar12 + 2] = tVar19;
                          ptVar6[uVar12 + 3] = tVar19;
                        }
                        uVar12 = uVar12 + 4;
                      } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                    }
                    goto LAB_00195983;
                  }
                  optr->ex_type = 1;
                  aVar11.v_int._1_7_ = 0;
                  aVar11.v_int._0_1_ = local_58.v_int == local_78.v_int;
                  goto LAB_00199f4e;
                }
                goto LAB_0019591f;
              }
              pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
            }
            uVar16 = 0x4cf;
            break;
          }
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
          auVar2 = _DAT_001b53a0;
          auVar88 = _DAT_001b5390;
          auVar87 = _DAT_001b5380;
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar6 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) {
LAB_0019b665:
                uVar16 = 0x4d1;
                goto LAB_0019b671;
              }
              optr->ex_type = 0xf;
              ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar6;
            }
            if (lStack_70 - 0xeU < 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (t_float)(-(uint)(local_78.v_vec[lVar10] != local_58.v_vec[lVar10]) &
                                0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (t_float)(-(uint)(local_58.v_vec[lVar10] != local_78.v_flt) & 0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 1) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (t_float)(-(uint)(local_58.v_vec[lVar10] != (float)local_78.v_int) &
                                0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
LAB_0019596b:
            pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar5 = (ex_ex *)0x0;
          }
          else {
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type == 0xf) {
                  ptVar6 = (optr->ex_cont).v_vec;
                }
                else {
                  if (optr->ex_type == 0xe) goto LAB_0019b665;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (t_float)(-(uint)(local_78.v_vec[lVar10] != local_58.v_flt) & 0x3f800000);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    tVar19 = (t_float)(-(uint)(local_78.v_flt != local_58.v_flt) & 0x3f800000);
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar86._8_4_ = (int)lVar10;
                    auVar86._0_8_ = lVar10;
                    auVar86._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar86 = auVar86 ^ _DAT_001b53a0;
                    do {
                      auVar170._8_4_ = (int)uVar12;
                      auVar170._0_8_ = uVar12;
                      auVar170._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar170 | auVar88) ^ auVar2;
                      iVar14 = auVar86._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar86._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar86._12_4_ || auVar25._8_4_ <= auVar86._8_4_) &&
                          auVar25._12_4_ <= auVar86._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar170 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar86._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = local_78.v_flt;
              }
              else {
                if (lStack_70 != 1) goto LAB_0019596b;
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    tVar19 = (t_float)(-(uint)((float)local_78.v_int != local_58.v_flt) & 0x3f800000
                                      );
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar53._8_4_ = (int)lVar10;
                    auVar53._0_8_ = lVar10;
                    auVar53._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar53 = auVar53 ^ _DAT_001b53a0;
                    do {
                      auVar141._8_4_ = (int)uVar12;
                      auVar141._0_8_ = uVar12;
                      auVar141._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar141 | auVar88) ^ auVar2;
                      iVar14 = auVar53._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar53._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar53._12_4_ || auVar25._8_4_ <= auVar53._8_4_) &&
                          auVar25._12_4_ <= auVar53._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar141 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar53._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = (float)local_78.v_int;
              }
              uVar4 = -(uint)((float)uVar9 != local_58.v_flt);
              goto LAB_00199f97;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type == 0xf) {
                  ptVar6 = (optr->ex_cont).v_vec;
                }
                else {
                  if (optr->ex_type == 0xe) goto LAB_0019b665;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (t_float)(-(uint)(local_78.v_vec[lVar10] != (float)local_58.v_int) &
                                  0x3f800000);
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    tVar19 = (t_float)(-(uint)((float)local_58.v_int != local_78.v_flt) & 0x3f800000
                                      );
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar85._8_4_ = (int)lVar10;
                    auVar85._0_8_ = lVar10;
                    auVar85._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar85 = auVar85 ^ _DAT_001b53a0;
                    do {
                      auVar169._8_4_ = (int)uVar12;
                      auVar169._0_8_ = uVar12;
                      auVar169._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar169 | auVar88) ^ auVar2;
                      iVar14 = auVar85._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar85._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar85._12_4_ || auVar25._8_4_ <= auVar85._8_4_) &&
                          auVar25._12_4_ <= auVar85._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar169 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar85._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar4 = -(uint)((float)local_58.v_int != local_78.v_flt);
                goto LAB_00199f97;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  if (local_58.v_int == local_78.v_int) {
                    tVar19 = 0.0;
                  }
                  else {
                    tVar19 = 1.0;
                  }
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar100._8_4_ = (int)lVar10;
                    auVar100._0_8_ = lVar10;
                    auVar100._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar100 = auVar100 ^ _DAT_001b53a0;
                    do {
                      auVar182._8_4_ = (int)uVar12;
                      auVar182._0_8_ = uVar12;
                      auVar182._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar182 | auVar88) ^ auVar2;
                      iVar14 = auVar100._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar100._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar100._12_4_ || auVar25._8_4_ <= auVar100._8_4_) &&
                          auVar25._12_4_ <= auVar100._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar182 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 &&
                          (iVar189 != iVar14 || auVar25._0_4_ <= auVar100._0_4_)) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 1;
                bVar17 = local_58.v_int == local_78.v_int;
                goto LAB_00199f4b;
              }
              goto LAB_0019596b;
            }
            pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar16 = 0x4d1;
        }
      }
    }
    else if (lVar10 < 0xd0013) {
      if (lVar10 < 0xc0010) {
        if (lVar10 != 0xb000e) {
          if (lVar10 != 0xb000f) goto LAB_001931eb;
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
          auVar2 = _DAT_001b53a0;
          auVar88 = _DAT_001b5390;
          auVar87 = _DAT_001b5380;
          if (lStack_50 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar6 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) {
LAB_0019b5b4:
                uVar16 = 0x4d8;
                goto LAB_0019b671;
              }
              optr->ex_type = 0xf;
              ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar6;
            }
            if (lStack_70 - 0xeU < 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (float)((int)local_58.v_vec[lVar10] <<
                              ((byte)(int)local_78.v_vec[lVar10] & 0x1f));
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (float)((int)local_58.v_vec[lVar10] << ((byte)(int)local_78.v_flt & 0x1f));
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 1) {
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (float)((int)local_58.v_vec[lVar10] <<
                              ((byte)(int)(float)local_78.v_int & 0x1f));
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
LAB_00195875:
            pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
            peVar5 = (ex_ex *)0x0;
          }
          else {
            uVar9 = local_78.v_flt;
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_0019b5b4;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (float)((int)local_58.v_flt << ((byte)(int)local_78.v_vec[lVar10] & 0x1f));
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              fVar18 = local_58.v_flt;
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    fVar18 = (float)((int)local_58.v_flt << ((byte)(int)(float)uVar9 & 0x1f));
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar63._8_4_ = (int)lVar10;
                    auVar63._0_8_ = lVar10;
                    auVar63._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar63 = auVar63 ^ _DAT_001b53a0;
                    do {
                      auVar151._8_4_ = (int)uVar12;
                      auVar151._0_8_ = uVar12;
                      auVar151._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar151 | auVar88) ^ auVar2;
                      iVar14 = auVar63._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar63._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = fVar18;
                      }
                      if ((auVar25._12_4_ != auVar63._12_4_ || auVar25._8_4_ <= auVar63._8_4_) &&
                          auVar25._12_4_ <= auVar63._12_4_) {
                        ptVar6[uVar12 + 1] = fVar18;
                      }
                      auVar25 = (auVar151 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar63._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = fVar18;
                        ptVar6[uVar12 + 3] = fVar18;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
LAB_00199ac7:
                uVar8 = (byte)(int)(float)uVar9;
              }
              else {
                if (lStack_70 != 1) goto LAB_00195875;
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    fVar18 = (float)((int)local_58.v_flt << (local_78.v_int._0_1_ & 0x1f));
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar42._8_4_ = (int)lVar10;
                    auVar42._0_8_ = lVar10;
                    auVar42._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar42 = auVar42 ^ _DAT_001b53a0;
                    do {
                      auVar130._8_4_ = (int)uVar12;
                      auVar130._0_8_ = uVar12;
                      auVar130._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar130 | auVar88) ^ auVar2;
                      iVar14 = auVar42._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar42._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = fVar18;
                      }
                      if ((auVar25._12_4_ != auVar42._12_4_ || auVar25._8_4_ <= auVar42._8_4_) &&
                          auVar25._12_4_ <= auVar42._12_4_) {
                        ptVar6[uVar12 + 1] = fVar18;
                      }
                      auVar25 = (auVar130 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar42._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = fVar18;
                        ptVar6[uVar12 + 3] = fVar18;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar8 = local_78.v_int._0_1_;
              }
              uVar4 = (int)fVar18 << (uVar8 & 0x1f);
              goto LAB_00199d0d;
            }
            if (lStack_50 == 1) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_0019b5b4;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = 0;
                  do {
                    ptVar6[lVar10] =
                         (float)((int)(float)local_58.v_int <<
                                ((byte)(int)local_78.v_vec[lVar10] & 0x1f));
                    lVar10 = lVar10 + 1;
                  } while (iVar3 != (int)lVar10);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    fVar18 = (float)((int)(float)local_58.v_int << ((byte)(int)(float)uVar9 & 0x1f))
                    ;
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar61._8_4_ = (int)lVar10;
                    auVar61._0_8_ = lVar10;
                    auVar61._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar61 = auVar61 ^ _DAT_001b53a0;
                    do {
                      auVar149._8_4_ = (int)uVar12;
                      auVar149._0_8_ = uVar12;
                      auVar149._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar149 | auVar88) ^ auVar2;
                      iVar14 = auVar61._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar61._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = fVar18;
                      }
                      if ((auVar25._12_4_ != auVar61._12_4_ || auVar25._8_4_ <= auVar61._8_4_) &&
                          auVar25._12_4_ <= auVar61._12_4_) {
                        ptVar6[uVar12 + 1] = fVar18;
                      }
                      auVar25 = (auVar149 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar61._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = fVar18;
                        ptVar6[uVar12 + 3] = fVar18;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                fVar18 = (float)local_58.v_int;
                goto LAB_00199ac7;
              }
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    fVar18 = (float)((int)local_58.v_flt << (local_78.v_int._0_1_ & 0x1f));
                    ptVar6 = (optr->ex_cont).v_vec;
                    lVar10 = (long)iVar3 + -1;
                    auVar27._8_4_ = (int)lVar10;
                    auVar27._0_8_ = lVar10;
                    auVar27._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar27 = auVar27 ^ _DAT_001b53a0;
                    do {
                      auVar115._8_4_ = (int)uVar12;
                      auVar115._0_8_ = uVar12;
                      auVar115._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar115 | auVar88) ^ auVar2;
                      iVar14 = auVar27._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar27._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = fVar18;
                      }
                      if ((auVar25._12_4_ != auVar27._12_4_ || auVar25._8_4_ <= auVar27._8_4_) &&
                          auVar25._12_4_ <= auVar27._12_4_) {
                        ptVar6[uVar12 + 1] = fVar18;
                      }
                      auVar25 = (auVar115 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar27._0_4_)
                         ) {
                        ptVar6[uVar12 + 2] = fVar18;
                        ptVar6[uVar12 + 3] = fVar18;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 1;
                uVar4 = (int)local_58.v_flt << (local_78.v_int._0_1_ & 0x1f);
                goto LAB_00199cf2;
              }
              goto LAB_00195875;
            }
            pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
          }
          uVar16 = 0x4d8;
          goto LAB_0019597c;
        }
        peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
        peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
        auVar2 = _DAT_001b53a0;
        auVar88 = _DAT_001b5390;
        auVar87 = _DAT_001b5380;
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar6 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0019b592:
              uVar16 = 0x4da;
              goto LAB_0019b671;
            }
            optr->ex_type = 0xf;
            ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar6;
          }
          if (lStack_70 - 0xeU < 2) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                ptVar6[lVar10] =
                     (float)((int)local_58.v_vec[lVar10] >>
                            ((byte)(int)local_78.v_vec[lVar10] & 0x1f));
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
            goto LAB_00195983;
          }
          if (lStack_70 == 2) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                ptVar6[lVar10] =
                     (float)((int)local_58.v_vec[lVar10] >> ((byte)(int)local_78.v_flt & 0x1f));
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
            goto LAB_00195983;
          }
          if (lStack_70 == 1) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                ptVar6[lVar10] =
                     (float)((int)local_58.v_vec[lVar10] >>
                            ((byte)(int)(float)local_78.v_int & 0x1f));
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
            goto LAB_00195983;
          }
LAB_00195849:
          pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar5 = (ex_ex *)0x0;
        }
        else {
          uVar9 = local_78.v_flt;
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) goto LAB_0019b592;
                optr->ex_type = 0xf;
                ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar6;
              }
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                ptVar6 = (optr->ex_cont).v_vec;
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (float)((int)local_58.v_flt >> ((byte)(int)local_78.v_vec[lVar10] & 0x1f));
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            fVar18 = local_58.v_flt;
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)((int)local_58.v_flt >> ((byte)(int)(float)uVar9 & 0x1f));
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar60._8_4_ = (int)lVar10;
                  auVar60._0_8_ = lVar10;
                  auVar60._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar60 = auVar60 ^ _DAT_001b53a0;
                  do {
                    auVar148._8_4_ = (int)uVar12;
                    auVar148._0_8_ = uVar12;
                    auVar148._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar148 | auVar88) ^ auVar2;
                    iVar14 = auVar60._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar60._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar60._12_4_ || auVar25._8_4_ <= auVar60._8_4_) &&
                        auVar25._12_4_ <= auVar60._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar148 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar60._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
LAB_001999ec:
              uVar8 = (byte)(int)(float)uVar9;
            }
            else {
              if (lStack_70 != 1) goto LAB_00195849;
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)((int)local_58.v_flt >> (local_78.v_int._0_1_ & 0x1f));
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar41._8_4_ = (int)lVar10;
                  auVar41._0_8_ = lVar10;
                  auVar41._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar41 = auVar41 ^ _DAT_001b53a0;
                  do {
                    auVar129._8_4_ = (int)uVar12;
                    auVar129._0_8_ = uVar12;
                    auVar129._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar129 | auVar88) ^ auVar2;
                    iVar14 = auVar41._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar41._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar41._12_4_ || auVar25._8_4_ <= auVar41._8_4_) &&
                        auVar25._12_4_ <= auVar41._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar129 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar41._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              uVar8 = local_78.v_int._0_1_;
            }
            uVar4 = (int)fVar18 >> (uVar8 & 0x1f);
LAB_00199d0d:
            tVar19 = (float)(int)uVar4;
            goto LAB_00199fc9;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type != 0xf) {
                if (optr->ex_type == 0xe) goto LAB_0019b592;
                optr->ex_type = 0xf;
                ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar6;
              }
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                ptVar6 = (optr->ex_cont).v_vec;
                lVar10 = 0;
                do {
                  ptVar6[lVar10] =
                       (float)((int)(float)local_58.v_int >>
                              ((byte)(int)local_78.v_vec[lVar10] & 0x1f));
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)((int)(float)local_58.v_int >> ((byte)(int)(float)uVar9 & 0x1f));
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar59._8_4_ = (int)lVar10;
                  auVar59._0_8_ = lVar10;
                  auVar59._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar59 = auVar59 ^ _DAT_001b53a0;
                  do {
                    auVar147._8_4_ = (int)uVar12;
                    auVar147._0_8_ = uVar12;
                    auVar147._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar147 | auVar88) ^ auVar2;
                    iVar14 = auVar59._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar59._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar59._12_4_ || auVar25._8_4_ <= auVar59._8_4_) &&
                        auVar25._12_4_ <= auVar59._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar147 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar59._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              fVar18 = (float)local_58.v_int;
              goto LAB_001999ec;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)((int)local_58.v_flt >> (local_78.v_int._0_1_ & 0x1f));
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar33._8_4_ = (int)lVar10;
                  auVar33._0_8_ = lVar10;
                  auVar33._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar33 = auVar33 ^ _DAT_001b53a0;
                  do {
                    auVar121._8_4_ = (int)uVar12;
                    auVar121._0_8_ = uVar12;
                    auVar121._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar121 | auVar88) ^ auVar2;
                    iVar14 = auVar33._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar33._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar33._12_4_ || auVar25._8_4_ <= auVar33._8_4_) &&
                        auVar25._12_4_ <= auVar33._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar121 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar33._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 1;
              uVar4 = (int)local_58.v_flt >> (local_78.v_int._0_1_ & 0x1f);
              goto LAB_00199cf2;
            }
            goto LAB_00195849;
          }
          pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar16 = 0x4da;
      }
      else if (lVar10 == 0xc0010) {
        peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
        peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
        auVar2 = _DAT_001b53a0;
        auVar88 = _DAT_001b5390;
        auVar87 = _DAT_001b5380;
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar6 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0019b581:
              uVar16 = 0x4c5;
              goto LAB_0019b671;
            }
            optr->ex_type = 0xf;
            ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar6;
          }
          if (lStack_70 - 0xeU < 2) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                ptVar6[lVar10] = local_58.v_vec[lVar10] - local_78.v_vec[lVar10];
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
            goto LAB_00195983;
          }
          if (lStack_70 == 2) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                ptVar6[lVar10] = local_58.v_vec[lVar10] - local_78.v_flt;
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
            goto LAB_00195983;
          }
          if (lStack_70 == 1) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                ptVar6[lVar10] = local_58.v_vec[lVar10] - (float)local_78.v_int;
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
            goto LAB_00195983;
          }
LAB_00195833:
          pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar5 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar6 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0019b581;
                optr->ex_type = 0xf;
                ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar6;
              }
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] = local_58.v_flt - local_78.v_vec[lVar10];
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = local_58.v_flt - local_78.v_flt;
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar58._8_4_ = (int)lVar10;
                  auVar58._0_8_ = lVar10;
                  auVar58._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar58 = auVar58 ^ _DAT_001b53a0;
                  do {
                    auVar146._8_4_ = (int)uVar12;
                    auVar146._0_8_ = uVar12;
                    auVar146._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar146 | auVar88) ^ auVar2;
                    iVar14 = auVar58._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar58._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar58._12_4_ || auVar25._8_4_ <= auVar58._8_4_) &&
                        auVar25._12_4_ <= auVar58._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar146 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar58._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              uVar9 = local_58.v_flt;
LAB_0019990a:
              tVar19 = (float)uVar9 - local_78.v_flt;
              goto LAB_00199fc9;
            }
            if (lStack_70 != 1) goto LAB_00195833;
            if (optr->ex_type == 0xf) {
              iVar3 = expr->exp_vsize;
              if (0 < (long)iVar3) {
                fVar18 = local_58.v_flt - (float)local_78.v_int;
                ptVar6 = (optr->ex_cont).v_vec;
                lVar10 = (long)iVar3 + -1;
                auVar39._8_4_ = (int)lVar10;
                auVar39._0_8_ = lVar10;
                auVar39._12_4_ = (int)((ulong)lVar10 >> 0x20);
                uVar12 = 0;
                auVar39 = auVar39 ^ _DAT_001b53a0;
                do {
                  auVar127._8_4_ = (int)uVar12;
                  auVar127._0_8_ = uVar12;
                  auVar127._12_4_ = (int)(uVar12 >> 0x20);
                  auVar25 = (auVar127 | auVar88) ^ auVar2;
                  iVar14 = auVar39._4_4_;
                  if ((bool)(~(auVar25._4_4_ == iVar14 && auVar39._0_4_ < auVar25._0_4_ ||
                              iVar14 < auVar25._4_4_) & 1)) {
                    ptVar6[uVar12] = fVar18;
                  }
                  if ((auVar25._12_4_ != auVar39._12_4_ || auVar25._8_4_ <= auVar39._8_4_) &&
                      auVar25._12_4_ <= auVar39._12_4_) {
                    ptVar6[uVar12 + 1] = fVar18;
                  }
                  auVar25 = (auVar127 | auVar87) ^ auVar2;
                  iVar189 = auVar25._4_4_;
                  if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar39._0_4_)) {
                    ptVar6[uVar12 + 2] = fVar18;
                    ptVar6[uVar12 + 3] = fVar18;
                  }
                  uVar12 = uVar12 + 4;
                } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
              }
              goto LAB_00195983;
            }
            optr->ex_type = 2;
            tVar19 = local_58.v_flt - (float)local_78.v_int;
            goto LAB_00199fa2;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar6 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0019b581;
                optr->ex_type = 0xf;
                ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar6;
              }
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] = (float)local_58.v_int - local_78.v_vec[lVar10];
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)local_58.v_int - local_78.v_flt;
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar57._8_4_ = (int)lVar10;
                  auVar57._0_8_ = lVar10;
                  auVar57._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar57 = auVar57 ^ _DAT_001b53a0;
                  do {
                    auVar145._8_4_ = (int)uVar12;
                    auVar145._0_8_ = uVar12;
                    auVar145._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar145 | auVar88) ^ auVar2;
                    iVar14 = auVar57._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar57._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar57._12_4_ || auVar25._8_4_ <= auVar57._8_4_) &&
                        auVar25._12_4_ <= auVar57._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar145 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar57._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              uVar9 = (float)local_58.v_int;
              goto LAB_0019990a;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)(local_58.v_int - local_78.v_int);
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar31._8_4_ = (int)lVar10;
                  auVar31._0_8_ = lVar10;
                  auVar31._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar31 = auVar31 ^ _DAT_001b53a0;
                  do {
                    auVar119._8_4_ = (int)uVar12;
                    auVar119._0_8_ = uVar12;
                    auVar119._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar119 | auVar88) ^ auVar2;
                    iVar14 = auVar31._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar31._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar31._12_4_ || auVar25._8_4_ <= auVar31._8_4_) &&
                        auVar25._12_4_ <= auVar31._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar119 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar31._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 1;
              aVar7.v_int = local_58.v_int - local_78.v_int;
              goto LAB_00199cf4;
            }
            goto LAB_00195833;
          }
          pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar16 = 0x4c5;
      }
      else {
        if (lVar10 != 0xc0011) {
          if (lVar10 != 0xd0012) goto LAB_001931eb;
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
          peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
          if (1 < lStack_50 - 0xeU) {
            if (lStack_50 == 2) {
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_0019b570;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                aVar7 = local_78;
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  ptVar6 = (optr->ex_cont).v_vec;
                  iVar14 = (int)local_58.v_flt;
                  lVar10 = 0;
                  do {
                    if ((int)aVar7.v_vec[lVar10] == 0) {
                      ex_dzdetect(expr);
                      iVar3 = expr->exp_vsize;
                      tVar19 = 0.0;
                    }
                    else {
                      tVar19 = (t_float)(iVar14 % (int)aVar7.v_vec[lVar10]);
                    }
                    ptVar6[lVar10] = tVar19;
                    lVar10 = lVar10 + 1;
                  } while ((int)lVar10 < iVar3);
                }
                goto LAB_00195983;
              }
              if (lStack_70 == 2) {
                if (optr->ex_type == 0xf) {
                  ptVar6 = (optr->ex_cont).v_vec;
                  if ((int)local_78.v_flt == 0) {
                    ex_dzdetect(expr);
                    tVar19 = 0.0;
                  }
                  else {
                    tVar19 = (t_float)((int)local_58.v_flt % (int)local_78.v_flt);
                  }
                  auVar2 = _DAT_001b53a0;
                  auVar88 = _DAT_001b5390;
                  auVar87 = _DAT_001b5380;
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    lVar10 = (long)iVar3 + -1;
                    auVar104._8_4_ = (int)lVar10;
                    auVar104._0_8_ = lVar10;
                    auVar104._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar104 = auVar104 ^ _DAT_001b53a0;
                    do {
                      auVar186._8_4_ = (int)uVar12;
                      auVar186._0_8_ = uVar12;
                      auVar186._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar186 | auVar88) ^ auVar2;
                      iVar14 = auVar104._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar104._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar104._12_4_ || auVar25._8_4_ <= auVar104._8_4_) &&
                          auVar25._12_4_ <= auVar104._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar186 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 &&
                          (iVar189 != iVar14 || auVar25._0_4_ <= auVar104._0_4_)) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = (undefined4)local_78.v_flt;
              }
              else {
                if (lStack_70 != 1) goto LAB_0019581d;
                if (optr->ex_type == 0xf) {
                  ptVar6 = (optr->ex_cont).v_vec;
                  if (local_78.v_flt == 0.0) {
                    ex_dzdetect(expr);
                    tVar19 = 0.0;
                  }
                  else {
                    tVar19 = (t_float)((int)local_58.v_flt % (int)local_78.v_int._0_4_);
                  }
                  auVar2 = _DAT_001b53a0;
                  auVar88 = _DAT_001b5390;
                  auVar87 = _DAT_001b5380;
                  iVar3 = expr->exp_vsize;
                  if (0 < (long)iVar3) {
                    lVar10 = (long)iVar3 + -1;
                    auVar102._8_4_ = (int)lVar10;
                    auVar102._0_8_ = lVar10;
                    auVar102._12_4_ = (int)((ulong)lVar10 >> 0x20);
                    uVar12 = 0;
                    auVar102 = auVar102 ^ _DAT_001b53a0;
                    do {
                      auVar184._8_4_ = (int)uVar12;
                      auVar184._0_8_ = uVar12;
                      auVar184._12_4_ = (int)(uVar12 >> 0x20);
                      auVar25 = (auVar184 | auVar88) ^ auVar2;
                      iVar14 = auVar102._4_4_;
                      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar102._0_4_ < auVar25._0_4_ ||
                                  iVar14 < auVar25._4_4_) & 1)) {
                        ptVar6[uVar12] = tVar19;
                      }
                      if ((auVar25._12_4_ != auVar102._12_4_ || auVar25._8_4_ <= auVar102._8_4_) &&
                          auVar25._12_4_ <= auVar102._12_4_) {
                        ptVar6[uVar12 + 1] = tVar19;
                      }
                      auVar25 = (auVar184 | auVar87) ^ auVar2;
                      iVar189 = auVar25._4_4_;
                      if (iVar189 <= iVar14 &&
                          (iVar189 != iVar14 || auVar25._0_4_ <= auVar102._0_4_)) {
                        ptVar6[uVar12 + 2] = tVar19;
                        ptVar6[uVar12 + 3] = tVar19;
                      }
                      uVar12 = uVar12 + 4;
                    } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                  }
                  goto LAB_00195983;
                }
                optr->ex_type = 2;
                uVar9 = local_78.v_flt;
              }
              uVar1 = local_58.v_flt;
              if ((float)uVar9 == 0.0) {
LAB_00199989:
                ex_dzdetect(expr);
                goto LAB_00199bbc;
              }
            }
            else {
              if (lStack_50 != 1) {
                pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
                goto LAB_00195826;
              }
              if (lStack_70 - 0xeU < 2) {
                if (optr->ex_type != 0xf) {
                  if (optr->ex_type == 0xe) goto LAB_0019b570;
                  optr->ex_type = 0xf;
                  ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                  (optr->ex_cont).v_vec = ptVar6;
                }
                aVar7 = local_78;
                iVar3 = expr->exp_vsize;
                if (0 < iVar3) {
                  ptVar6 = (optr->ex_cont).v_vec;
                  fVar18 = (float)local_58.v_int;
                  lVar10 = 0;
                  do {
                    if ((int)aVar7.v_vec[lVar10] == 0) {
                      ex_dzdetect(expr);
                      iVar3 = expr->exp_vsize;
                      tVar19 = 0.0;
                    }
                    else {
                      tVar19 = (t_float)((int)fVar18 % (int)aVar7.v_vec[lVar10]);
                    }
                    ptVar6[lVar10] = tVar19;
                    lVar10 = lVar10 + 1;
                  } while ((int)lVar10 < iVar3);
                }
                goto LAB_00195983;
              }
              if (lStack_70 != 2) {
                if (lStack_70 == 1) {
                  if (optr->ex_type == 0xf) {
                    ptVar6 = (optr->ex_cont).v_vec;
                    if (local_78.v_flt == 0.0) {
                      ex_dzdetect(expr);
                      tVar19 = 0.0;
                    }
                    else {
                      tVar19 = (t_float)((int)local_58.v_int._0_4_ % (int)local_78.v_int._0_4_);
                    }
                    auVar2 = _DAT_001b53a0;
                    auVar88 = _DAT_001b5390;
                    auVar87 = _DAT_001b5380;
                    iVar3 = expr->exp_vsize;
                    if (0 < (long)iVar3) {
                      lVar10 = (long)iVar3 + -1;
                      auVar101._8_4_ = (int)lVar10;
                      auVar101._0_8_ = lVar10;
                      auVar101._12_4_ = (int)((ulong)lVar10 >> 0x20);
                      uVar12 = 0;
                      auVar101 = auVar101 ^ _DAT_001b53a0;
                      do {
                        auVar183._8_4_ = (int)uVar12;
                        auVar183._0_8_ = uVar12;
                        auVar183._12_4_ = (int)(uVar12 >> 0x20);
                        auVar25 = (auVar183 | auVar88) ^ auVar2;
                        iVar14 = auVar101._4_4_;
                        if ((bool)(~(auVar25._4_4_ == iVar14 && auVar101._0_4_ < auVar25._0_4_ ||
                                    iVar14 < auVar25._4_4_) & 1)) {
                          ptVar6[uVar12] = tVar19;
                        }
                        if ((auVar25._12_4_ != auVar101._12_4_ || auVar25._8_4_ <= auVar101._8_4_)
                            && auVar25._12_4_ <= auVar101._12_4_) {
                          ptVar6[uVar12 + 1] = tVar19;
                        }
                        auVar25 = (auVar183 | auVar87) ^ auVar2;
                        iVar189 = auVar25._4_4_;
                        if (iVar189 <= iVar14 &&
                            (iVar189 != iVar14 || auVar25._0_4_ <= auVar101._0_4_)) {
                          ptVar6[uVar12 + 2] = tVar19;
                          ptVar6[uVar12 + 3] = tVar19;
                        }
                        uVar12 = uVar12 + 4;
                      } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                    }
                    goto LAB_00195983;
                  }
                  optr->ex_type = 1;
                  if (local_78.v_flt == 0.0) goto LAB_00199fac;
                  aVar7 = (anon_union_8_5_735de1bb_for_ex_cont)
                          (long)((int)local_58.v_int._0_4_ % (int)local_78.v_int._0_4_);
                  goto LAB_00199cf4;
                }
                goto LAB_0019581d;
              }
              if (optr->ex_type == 0xf) {
                ptVar6 = (optr->ex_cont).v_vec;
                if ((int)local_78.v_flt == 0) {
                  ex_dzdetect(expr);
                  tVar19 = 0.0;
                }
                else {
                  tVar19 = (t_float)((int)(float)local_58.v_int % (int)local_78.v_flt);
                }
                auVar2 = _DAT_001b53a0;
                auVar88 = _DAT_001b5390;
                auVar87 = _DAT_001b5380;
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  lVar10 = (long)iVar3 + -1;
                  auVar103._8_4_ = (int)lVar10;
                  auVar103._0_8_ = lVar10;
                  auVar103._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar103 = auVar103 ^ _DAT_001b53a0;
                  do {
                    auVar185._8_4_ = (int)uVar12;
                    auVar185._0_8_ = uVar12;
                    auVar185._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar185 | auVar88) ^ auVar2;
                    iVar14 = auVar103._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar103._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = tVar19;
                    }
                    if ((auVar25._12_4_ != auVar103._12_4_ || auVar25._8_4_ <= auVar103._8_4_) &&
                        auVar25._12_4_ <= auVar103._12_4_) {
                      ptVar6[uVar12 + 1] = tVar19;
                    }
                    auVar25 = (auVar185 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar103._0_4_))
                    {
                      ptVar6[uVar12 + 2] = tVar19;
                      ptVar6[uVar12 + 3] = tVar19;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              uVar9 = (undefined4)local_78.v_flt;
              if ((float)uVar9 == 0.0) goto LAB_00199989;
              uVar1 = (float)local_58.v_int;
            }
            tVar19 = (float)((int)(float)uVar1 % (int)uVar9);
            goto LAB_00199fc9;
          }
          if (optr->ex_type == 0xf) {
            ptVar6 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0019b570:
              uVar16 = 0x4ec;
              goto LAB_0019b671;
            }
            optr->ex_type = 0xf;
            ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar6;
          }
          aVar11 = local_58;
          aVar7 = local_78;
          if (lStack_70 - 0xeU < 2) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                if ((int)aVar7.v_vec[lVar10] == 0) {
                  ex_dzdetect(expr);
                  iVar3 = expr->exp_vsize;
                  tVar19 = 0.0;
                }
                else {
                  tVar19 = (t_float)((int)aVar11.v_vec[lVar10] % (int)aVar7.v_vec[lVar10]);
                }
                ptVar6[lVar10] = tVar19;
                lVar10 = lVar10 + 1;
              } while ((int)lVar10 < iVar3);
            }
            goto LAB_00195983;
          }
          if (lStack_70 == 2) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              iVar14 = (int)local_78.v_flt;
              lVar10 = 0;
              do {
                if (iVar14 == 0) {
                  ex_dzdetect(expr);
                  iVar3 = expr->exp_vsize;
                  tVar19 = 0.0;
                }
                else {
                  tVar19 = (t_float)((int)aVar11.v_vec[lVar10] % iVar14);
                }
                ptVar6[lVar10] = tVar19;
                lVar10 = lVar10 + 1;
              } while ((int)lVar10 < iVar3);
            }
            goto LAB_00195983;
          }
          if (lStack_70 == 1) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              fVar18 = (float)local_78.v_int;
              lVar10 = 0;
              do {
                if ((int)fVar18 == 0) {
                  ex_dzdetect(expr);
                  iVar3 = expr->exp_vsize;
                  tVar19 = 0.0;
                }
                else {
                  tVar19 = (t_float)((int)aVar11.v_vec[lVar10] % (int)fVar18);
                }
                ptVar6[lVar10] = tVar19;
                lVar10 = lVar10 + 1;
              } while ((int)lVar10 < iVar3);
            }
            goto LAB_00195983;
          }
LAB_0019581d:
          pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar5 = (ex_ex *)0x0;
LAB_00195826:
          uVar16 = 0x4ec;
          goto LAB_0019597c;
        }
        peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
        peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
        auVar2 = _DAT_001b53a0;
        auVar88 = _DAT_001b5390;
        auVar87 = _DAT_001b5380;
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar6 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0019b55f:
              uVar16 = 0x4c3;
              goto LAB_0019b671;
            }
            optr->ex_type = 0xf;
            ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar6;
          }
          if (lStack_70 - 0xeU < 2) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                ptVar6[lVar10] = local_58.v_vec[lVar10] + local_78.v_vec[lVar10];
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
            goto LAB_00195983;
          }
          if (lStack_70 == 2) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                ptVar6[lVar10] = local_58.v_vec[lVar10] + local_78.v_flt;
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
            goto LAB_00195983;
          }
          if (lStack_70 == 1) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                ptVar6[lVar10] = local_58.v_vec[lVar10] + (float)local_78.v_int;
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
            goto LAB_00195983;
          }
LAB_00195807:
          pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar5 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar6 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0019b55f;
                optr->ex_type = 0xf;
                ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar6;
              }
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] = local_78.v_vec[lVar10] + local_58.v_flt;
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = local_58.v_flt + local_78.v_flt;
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar56._8_4_ = (int)lVar10;
                  auVar56._0_8_ = lVar10;
                  auVar56._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar56 = auVar56 ^ _DAT_001b53a0;
                  do {
                    auVar144._8_4_ = (int)uVar12;
                    auVar144._0_8_ = uVar12;
                    auVar144._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar144 | auVar88) ^ auVar2;
                    iVar14 = auVar56._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar56._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar56._12_4_ || auVar25._8_4_ <= auVar56._8_4_) &&
                        auVar25._12_4_ <= auVar56._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar144 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar56._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              uVar9 = local_58.v_flt;
LAB_0019982d:
              tVar19 = (float)uVar9 + local_78.v_flt;
              goto LAB_00199fc9;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)local_78.v_int + local_58.v_flt;
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar36._8_4_ = (int)lVar10;
                  auVar36._0_8_ = lVar10;
                  auVar36._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar36 = auVar36 ^ _DAT_001b53a0;
                  do {
                    auVar124._8_4_ = (int)uVar12;
                    auVar124._0_8_ = uVar12;
                    auVar124._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar124 | auVar88) ^ auVar2;
                    iVar14 = auVar36._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar36._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar36._12_4_ || auVar25._8_4_ <= auVar36._8_4_) &&
                        auVar25._12_4_ <= auVar36._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar124 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar36._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              tVar19 = (float)local_78.v_int + local_58.v_flt;
              goto LAB_00199fc9;
            }
            goto LAB_00195807;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar6 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0019b55f;
                optr->ex_type = 0xf;
                ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar6;
              }
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] = local_78.v_vec[lVar10] + (float)local_58.v_int;
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)local_58.v_int + local_78.v_flt;
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar55._8_4_ = (int)lVar10;
                  auVar55._0_8_ = lVar10;
                  auVar55._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar55 = auVar55 ^ _DAT_001b53a0;
                  do {
                    auVar143._8_4_ = (int)uVar12;
                    auVar143._0_8_ = uVar12;
                    auVar143._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar143 | auVar88) ^ auVar2;
                    iVar14 = auVar55._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar55._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar55._12_4_ || auVar25._8_4_ <= auVar55._8_4_) &&
                        auVar25._12_4_ <= auVar55._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar143 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar55._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              uVar9 = (float)local_58.v_int;
              goto LAB_0019982d;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)(local_78.v_int + local_58.v_int);
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar29._8_4_ = (int)lVar10;
                  auVar29._0_8_ = lVar10;
                  auVar29._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar29 = auVar29 ^ _DAT_001b53a0;
                  do {
                    auVar117._8_4_ = (int)uVar12;
                    auVar117._0_8_ = uVar12;
                    auVar117._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar117 | auVar88) ^ auVar2;
                    iVar14 = auVar29._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar29._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar29._12_4_ || auVar25._8_4_ <= auVar29._8_4_) &&
                        auVar25._12_4_ <= auVar29._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar117 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar29._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 1;
              aVar7.v_int = local_78.v_int + local_58.v_int;
              goto LAB_00199cf4;
            }
            goto LAB_00195807;
          }
          pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar16 = 0x4c3;
      }
    }
    else {
      if (0xe0014 < lVar10) {
        if (lVar10 != 0xe0015) {
          if (lVar10 == 0xe0016) {
            peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
            auVar2 = _DAT_001b53a0;
            auVar88 = _DAT_001b5390;
            auVar87 = _DAT_001b5380;
            if (lStack_50 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar6 = (optr->ex_cont).v_vec;
              }
              else {
                optr->ex_type = 0xf;
                ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar6;
              }
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] = (float)~(long)local_58.v_vec[lVar10];
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_50 == 2) {
              if (optr->ex_type == 0xf) {
                uVar12 = (ulong)(uint)expr->exp_vsize;
                if (uVar12 != 0) {
                  fVar18 = (float)~(long)local_58.v_flt;
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = uVar12 - 1;
                  auVar37._8_4_ = (int)lVar10;
                  auVar37._0_8_ = lVar10;
                  auVar37._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar13 = 0;
                  auVar37 = auVar37 ^ _DAT_001b53a0;
                  do {
                    auVar125._8_4_ = (int)uVar13;
                    auVar125._0_8_ = uVar13;
                    auVar125._12_4_ = (int)(uVar13 >> 0x20);
                    auVar25 = (auVar125 | auVar88) ^ auVar2;
                    iVar3 = auVar37._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar3 && auVar37._0_4_ < auVar25._0_4_ ||
                                iVar3 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar13] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar37._12_4_ || auVar25._8_4_ <= auVar37._8_4_) &&
                        auVar25._12_4_ <= auVar37._12_4_) {
                      ptVar6[uVar13 + 1] = fVar18;
                    }
                    auVar25 = (auVar125 | auVar87) ^ auVar2;
                    iVar14 = auVar25._4_4_;
                    if (iVar14 <= iVar3 && (iVar14 != iVar3 || auVar25._0_4_ <= auVar37._0_4_)) {
                      ptVar6[uVar13 + 2] = fVar18;
                      ptVar6[uVar13 + 3] = fVar18;
                    }
                    uVar13 = uVar13 + 4;
                  } while ((uVar12 + 3 & 0xfffffffffffffffc) != uVar13);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              tVar19 = (float)~(long)local_58.v_flt;
              goto LAB_00199fc9;
            }
            if (lStack_50 != 1) {
              pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
              peVar5 = (ex_ex *)0x0;
              uVar16 = 0x4bd;
              goto LAB_0019597c;
            }
            if (optr->ex_type == 0xf) {
              uVar12 = (ulong)(uint)expr->exp_vsize;
              if (uVar12 != 0) {
                fVar18 = (float)~local_58.v_int;
                ptVar6 = (optr->ex_cont).v_vec;
                lVar10 = uVar12 - 1;
                auVar30._8_4_ = (int)lVar10;
                auVar30._0_8_ = lVar10;
                auVar30._12_4_ = (int)((ulong)lVar10 >> 0x20);
                uVar13 = 0;
                auVar30 = auVar30 ^ _DAT_001b53a0;
                do {
                  auVar118._8_4_ = (int)uVar13;
                  auVar118._0_8_ = uVar13;
                  auVar118._12_4_ = (int)(uVar13 >> 0x20);
                  auVar25 = (auVar118 | auVar88) ^ auVar2;
                  iVar3 = auVar30._4_4_;
                  if ((bool)(~(auVar25._4_4_ == iVar3 && auVar30._0_4_ < auVar25._0_4_ ||
                              iVar3 < auVar25._4_4_) & 1)) {
                    ptVar6[uVar13] = fVar18;
                  }
                  if ((auVar25._12_4_ != auVar30._12_4_ || auVar25._8_4_ <= auVar30._8_4_) &&
                      auVar25._12_4_ <= auVar30._12_4_) {
                    ptVar6[uVar13 + 1] = fVar18;
                  }
                  auVar25 = (auVar118 | auVar87) ^ auVar2;
                  iVar14 = auVar25._4_4_;
                  if (iVar14 <= iVar3 && (iVar14 != iVar3 || auVar25._0_4_ <= auVar30._0_4_)) {
                    ptVar6[uVar13 + 2] = fVar18;
                    ptVar6[uVar13 + 3] = fVar18;
                  }
                  uVar13 = uVar13 + 4;
                } while ((uVar12 + 3 & 0xfffffffffffffffc) != uVar13);
              }
              goto LAB_00195983;
            }
            optr->ex_type = 1;
            aVar7.v_int = ~local_58.v_int;
          }
          else {
            if (lVar10 != 0xe0017) goto LAB_001931eb;
            peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
            auVar2 = _DAT_001b53a0;
            auVar88 = _DAT_001b5390;
            auVar87 = _DAT_001b5380;
            if (lStack_50 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar6 = (optr->ex_cont).v_vec;
              }
              else {
                optr->ex_type = 0xf;
                ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar6;
              }
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] = (t_float)(-(uint)(local_58.v_vec[lVar10] == 0.0) & 0x3f800000);
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_50 == 2) {
              if (optr->ex_type == 0xf) {
                uVar12 = (ulong)(uint)expr->exp_vsize;
                if (uVar12 != 0) {
                  tVar19 = (t_float)(-(uint)(local_58.v_flt == 0.0) & 0x3f800000);
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = uVar12 - 1;
                  auVar38._8_4_ = (int)lVar10;
                  auVar38._0_8_ = lVar10;
                  auVar38._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar13 = 0;
                  auVar38 = auVar38 ^ _DAT_001b53a0;
                  do {
                    auVar126._8_4_ = (int)uVar13;
                    auVar126._0_8_ = uVar13;
                    auVar126._12_4_ = (int)(uVar13 >> 0x20);
                    auVar25 = (auVar126 | auVar88) ^ auVar2;
                    iVar3 = auVar38._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar3 && auVar38._0_4_ < auVar25._0_4_ ||
                                iVar3 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar13] = tVar19;
                    }
                    if ((auVar25._12_4_ != auVar38._12_4_ || auVar25._8_4_ <= auVar38._8_4_) &&
                        auVar25._12_4_ <= auVar38._12_4_) {
                      ptVar6[uVar13 + 1] = tVar19;
                    }
                    auVar25 = (auVar126 | auVar87) ^ auVar2;
                    iVar14 = auVar25._4_4_;
                    if (iVar14 <= iVar3 && (iVar14 != iVar3 || auVar25._0_4_ <= auVar38._0_4_)) {
                      ptVar6[uVar13 + 2] = tVar19;
                      ptVar6[uVar13 + 3] = tVar19;
                    }
                    uVar13 = uVar13 + 4;
                  } while ((uVar12 + 3 & 0xfffffffffffffffc) != uVar13);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              uVar9 = 0.0;
              goto LAB_00195e70;
            }
            if (lStack_50 != 1) {
              pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
              peVar5 = (ex_ex *)0x0;
              uVar16 = 0x4bb;
              goto LAB_0019597c;
            }
            if (optr->ex_type == 0xf) {
              if ((void *)local_58.v_int == (void *)0x0) {
                tVar19 = 1.0;
              }
              else {
                tVar19 = 0.0;
              }
              uVar12 = (ulong)(uint)expr->exp_vsize;
              if (uVar12 != 0) {
                ptVar6 = (optr->ex_cont).v_vec;
                lVar10 = uVar12 - 1;
                auVar54._8_4_ = (int)lVar10;
                auVar54._0_8_ = lVar10;
                auVar54._12_4_ = (int)((ulong)lVar10 >> 0x20);
                uVar13 = 0;
                auVar54 = auVar54 ^ _DAT_001b53a0;
                do {
                  auVar142._8_4_ = (int)uVar13;
                  auVar142._0_8_ = uVar13;
                  auVar142._12_4_ = (int)(uVar13 >> 0x20);
                  auVar25 = (auVar142 | auVar88) ^ auVar2;
                  iVar3 = auVar54._4_4_;
                  if ((bool)(~(auVar25._4_4_ == iVar3 && auVar54._0_4_ < auVar25._0_4_ ||
                              iVar3 < auVar25._4_4_) & 1)) {
                    ptVar6[uVar13] = tVar19;
                  }
                  if ((auVar25._12_4_ != auVar54._12_4_ || auVar25._8_4_ <= auVar54._8_4_) &&
                      auVar25._12_4_ <= auVar54._12_4_) {
                    ptVar6[uVar13 + 1] = tVar19;
                  }
                  auVar25 = (auVar142 | auVar87) ^ auVar2;
                  iVar14 = auVar25._4_4_;
                  if (iVar14 <= iVar3 && (iVar14 != iVar3 || auVar25._0_4_ <= auVar54._0_4_)) {
                    ptVar6[uVar13 + 2] = tVar19;
                    ptVar6[uVar13 + 3] = tVar19;
                  }
                  uVar13 = uVar13 + 4;
                } while ((uVar12 + 3 & 0xfffffffffffffffc) != uVar13);
              }
              goto LAB_00195983;
            }
            optr->ex_type = 1;
            aVar7.v_int._1_7_ = 0;
            aVar7.v_int._0_1_ = (void *)local_58.v_int == (void *)0x0;
          }
LAB_00199cf4:
          optr->ex_cont = aVar7;
          goto LAB_00195983;
        }
        peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
        auVar2 = _DAT_001b53a0;
        auVar88 = _DAT_001b5390;
        auVar87 = _DAT_001b5380;
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar6 = (optr->ex_cont).v_vec;
          }
          else {
            optr->ex_type = 0xf;
            ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar6;
          }
          iVar3 = expr->exp_vsize;
          if (0 < iVar3) {
            lVar10 = 0;
            do {
              ptVar6[lVar10] = -local_58.v_vec[lVar10];
              lVar10 = lVar10 + 1;
            } while (iVar3 != (int)lVar10);
          }
          goto LAB_00195983;
        }
        if (lStack_50 == 2) {
          if (optr->ex_type == 0xf) {
            uVar12 = (ulong)(uint)expr->exp_vsize;
            if (uVar12 != 0) {
              tVar19 = -local_58.v_flt;
              ptVar6 = (optr->ex_cont).v_vec;
              lVar10 = uVar12 - 1;
              auVar40._8_4_ = (int)lVar10;
              auVar40._0_8_ = lVar10;
              auVar40._12_4_ = (int)((ulong)lVar10 >> 0x20);
              uVar13 = 0;
              auVar40 = auVar40 ^ _DAT_001b53a0;
              do {
                auVar128._8_4_ = (int)uVar13;
                auVar128._0_8_ = uVar13;
                auVar128._12_4_ = (int)(uVar13 >> 0x20);
                auVar25 = (auVar128 | auVar88) ^ auVar2;
                iVar3 = auVar40._4_4_;
                if ((bool)(~(auVar25._4_4_ == iVar3 && auVar40._0_4_ < auVar25._0_4_ ||
                            iVar3 < auVar25._4_4_) & 1)) {
                  ptVar6[uVar13] = tVar19;
                }
                if ((auVar25._12_4_ != auVar40._12_4_ || auVar25._8_4_ <= auVar40._8_4_) &&
                    auVar25._12_4_ <= auVar40._12_4_) {
                  ptVar6[uVar13 + 1] = tVar19;
                }
                auVar25 = (auVar128 | auVar87) ^ auVar2;
                iVar14 = auVar25._4_4_;
                if (iVar14 <= iVar3 && (iVar14 != iVar3 || auVar25._0_4_ <= auVar40._0_4_)) {
                  ptVar6[uVar13 + 2] = tVar19;
                  ptVar6[uVar13 + 3] = tVar19;
                }
                uVar13 = uVar13 + 4;
              } while ((uVar12 + 3 & 0xfffffffffffffffc) != uVar13);
            }
            goto LAB_00195983;
          }
          optr->ex_type = 2;
          tVar19 = -local_58.v_flt;
          goto LAB_00199fc9;
        }
        if (lStack_50 == 1) {
          if (optr->ex_type == 0xf) {
            uVar12 = (ulong)(uint)expr->exp_vsize;
            if (uVar12 != 0) {
              fVar18 = (float)-local_58.v_int;
              ptVar6 = (optr->ex_cont).v_vec;
              lVar10 = uVar12 - 1;
              auVar32._8_4_ = (int)lVar10;
              auVar32._0_8_ = lVar10;
              auVar32._12_4_ = (int)((ulong)lVar10 >> 0x20);
              uVar13 = 0;
              auVar32 = auVar32 ^ _DAT_001b53a0;
              do {
                auVar120._8_4_ = (int)uVar13;
                auVar120._0_8_ = uVar13;
                auVar120._12_4_ = (int)(uVar13 >> 0x20);
                auVar25 = (auVar120 | auVar88) ^ auVar2;
                iVar3 = auVar32._4_4_;
                if ((bool)(~(auVar25._4_4_ == iVar3 && auVar32._0_4_ < auVar25._0_4_ ||
                            iVar3 < auVar25._4_4_) & 1)) {
                  ptVar6[uVar13] = fVar18;
                }
                if ((auVar25._12_4_ != auVar32._12_4_ || auVar25._8_4_ <= auVar32._8_4_) &&
                    auVar25._12_4_ <= auVar32._12_4_) {
                  ptVar6[uVar13 + 1] = fVar18;
                }
                auVar25 = (auVar120 | auVar87) ^ auVar2;
                iVar14 = auVar25._4_4_;
                if (iVar14 <= iVar3 && (iVar14 != iVar3 || auVar25._0_4_ <= auVar32._0_4_)) {
                  ptVar6[uVar13 + 2] = fVar18;
                  ptVar6[uVar13 + 3] = fVar18;
                }
                uVar13 = uVar13 + 4;
              } while ((uVar12 + 3 & 0xfffffffffffffffc) != uVar13);
            }
            goto LAB_00195983;
          }
          optr->ex_type = 1;
          aVar7.v_int = -local_58.v_int;
          goto LAB_00199cf4;
        }
        pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
        peVar5 = (ex_ex *)0x0;
        uVar16 = 0x4bf;
        goto LAB_0019597c;
      }
      if (lVar10 != 0xd0013) {
        if (lVar10 != 0xd0014) goto LAB_001931eb;
        peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
        peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
        auVar2 = _DAT_001b53a0;
        auVar88 = _DAT_001b5390;
        auVar87 = _DAT_001b5380;
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar6 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0019b5c5:
              uVar16 = 0x4c1;
              goto LAB_0019b671;
            }
            optr->ex_type = 0xf;
            ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar6;
          }
          if (lStack_70 - 0xeU < 2) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                ptVar6[lVar10] = local_58.v_vec[lVar10] * local_78.v_vec[lVar10];
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
            goto LAB_00195983;
          }
          if (lStack_70 == 2) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                ptVar6[lVar10] = local_58.v_vec[lVar10] * local_78.v_flt;
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
            goto LAB_00195983;
          }
          if (lStack_70 == 1) {
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              lVar10 = 0;
              do {
                ptVar6[lVar10] = local_58.v_vec[lVar10] * (float)local_78.v_int;
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
            goto LAB_00195983;
          }
LAB_0019588b:
          pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar5 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar6 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0019b5c5;
                optr->ex_type = 0xf;
                ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar6;
              }
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] = local_78.v_vec[lVar10] * local_58.v_flt;
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = local_58.v_flt * local_78.v_flt;
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar64._8_4_ = (int)lVar10;
                  auVar64._0_8_ = lVar10;
                  auVar64._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar64 = auVar64 ^ _DAT_001b53a0;
                  do {
                    auVar152._8_4_ = (int)uVar12;
                    auVar152._0_8_ = uVar12;
                    auVar152._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar152 | auVar88) ^ auVar2;
                    iVar14 = auVar64._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar64._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar64._12_4_ || auVar25._8_4_ <= auVar64._8_4_) &&
                        auVar25._12_4_ <= auVar64._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar152 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar64._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              uVar9 = local_58.v_flt;
LAB_00199ae1:
              tVar19 = (float)uVar9 * local_78.v_flt;
              goto LAB_00199fc9;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)local_78.v_int * local_58.v_flt;
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar43._8_4_ = (int)lVar10;
                  auVar43._0_8_ = lVar10;
                  auVar43._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar43 = auVar43 ^ _DAT_001b53a0;
                  do {
                    auVar131._8_4_ = (int)uVar12;
                    auVar131._0_8_ = uVar12;
                    auVar131._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar131 | auVar88) ^ auVar2;
                    iVar14 = auVar43._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar43._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar43._12_4_ || auVar25._8_4_ <= auVar43._8_4_) &&
                        auVar25._12_4_ <= auVar43._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar131 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar43._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              tVar19 = (float)local_78.v_int * local_58.v_flt;
              goto LAB_00199fc9;
            }
            goto LAB_0019588b;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar6 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0019b5c5;
                optr->ex_type = 0xf;
                ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar6;
              }
              iVar3 = expr->exp_vsize;
              if (0 < iVar3) {
                lVar10 = 0;
                do {
                  ptVar6[lVar10] = local_78.v_vec[lVar10] * (float)local_58.v_int;
                  lVar10 = lVar10 + 1;
                } while (iVar3 != (int)lVar10);
              }
              goto LAB_00195983;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)local_58.v_int * local_78.v_flt;
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar62._8_4_ = (int)lVar10;
                  auVar62._0_8_ = lVar10;
                  auVar62._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar62 = auVar62 ^ _DAT_001b53a0;
                  do {
                    auVar150._8_4_ = (int)uVar12;
                    auVar150._0_8_ = uVar12;
                    auVar150._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar150 | auVar88) ^ auVar2;
                    iVar14 = auVar62._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar62._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar62._12_4_ || auVar25._8_4_ <= auVar62._8_4_) &&
                        auVar25._12_4_ <= auVar62._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar150 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar62._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 2;
              uVar9 = (float)local_58.v_int;
              goto LAB_00199ae1;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                iVar3 = expr->exp_vsize;
                if (0 < (long)iVar3) {
                  fVar18 = (float)(local_78.v_int * local_58.v_int);
                  ptVar6 = (optr->ex_cont).v_vec;
                  lVar10 = (long)iVar3 + -1;
                  auVar28._8_4_ = (int)lVar10;
                  auVar28._0_8_ = lVar10;
                  auVar28._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  uVar12 = 0;
                  auVar28 = auVar28 ^ _DAT_001b53a0;
                  do {
                    auVar116._8_4_ = (int)uVar12;
                    auVar116._0_8_ = uVar12;
                    auVar116._12_4_ = (int)(uVar12 >> 0x20);
                    auVar25 = (auVar116 | auVar88) ^ auVar2;
                    iVar14 = auVar28._4_4_;
                    if ((bool)(~(auVar25._4_4_ == iVar14 && auVar28._0_4_ < auVar25._0_4_ ||
                                iVar14 < auVar25._4_4_) & 1)) {
                      ptVar6[uVar12] = fVar18;
                    }
                    if ((auVar25._12_4_ != auVar28._12_4_ || auVar25._8_4_ <= auVar28._8_4_) &&
                        auVar25._12_4_ <= auVar28._12_4_) {
                      ptVar6[uVar12 + 1] = fVar18;
                    }
                    auVar25 = (auVar116 | auVar87) ^ auVar2;
                    iVar189 = auVar25._4_4_;
                    if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar28._0_4_))
                    {
                      ptVar6[uVar12 + 2] = fVar18;
                      ptVar6[uVar12 + 3] = fVar18;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
                }
                goto LAB_00195983;
              }
              optr->ex_type = 1;
              aVar7.v_int = local_78.v_int * local_58.v_int;
              goto LAB_00199cf4;
            }
            goto LAB_0019588b;
          }
          pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar16 = 0x4c1;
        goto LAB_0019597c;
      }
      peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_58,idx);
      peVar5 = ex_eval(expr,peVar5,(ex_ex *)&local_78,idx);
      if (lStack_50 - 0xeU < 2) {
        if (optr->ex_type == 0xf) {
          ptVar6 = (optr->ex_cont).v_vec;
        }
        else {
          if (optr->ex_type == 0xe) {
LAB_0019b5a3:
            uVar16 = 0x4f3;
            goto LAB_0019b671;
          }
          optr->ex_type = 0xf;
          ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
          (optr->ex_cont).v_vec = ptVar6;
        }
        aVar11 = local_58;
        aVar7 = local_78;
        if (lStack_70 - 0xeU < 2) {
          iVar3 = expr->exp_vsize;
          if (0 < iVar3) {
            lVar10 = 0;
            do {
              fVar18 = aVar7.v_vec[lVar10];
              if ((fVar18 != 0.0) || (NAN(fVar18))) {
                tVar19 = aVar11.v_vec[lVar10] / fVar18;
              }
              else {
                ex_dzdetect(expr);
                iVar3 = expr->exp_vsize;
                tVar19 = 0.0;
              }
              ptVar6[lVar10] = tVar19;
              lVar10 = lVar10 + 1;
            } while ((int)lVar10 < iVar3);
          }
          goto LAB_00195983;
        }
        if (lStack_70 == 2) {
          iVar3 = expr->exp_vsize;
          if (0 < iVar3) {
            lVar10 = 0;
            local_34 = local_78.v_flt;
            uVar9 = local_78.v_flt;
            do {
              if (((float)uVar9 != 0.0) || (NAN((float)uVar9))) {
                tVar19 = aVar11.v_vec[lVar10] / (float)uVar9;
              }
              else {
                ex_dzdetect(expr);
                iVar3 = expr->exp_vsize;
                tVar19 = 0.0;
                uVar9 = local_34;
              }
              ptVar6[lVar10] = tVar19;
              lVar10 = lVar10 + 1;
            } while ((int)lVar10 < iVar3);
          }
          goto LAB_00195983;
        }
        if (lStack_70 == 1) {
          iVar3 = expr->exp_vsize;
          if (0 < iVar3) {
            local_34 = (t_float)local_78.v_int;
            lVar10 = 0;
            do {
              if ((void *)aVar7.v_int == (void *)0x0) {
                ex_dzdetect(expr);
                iVar3 = expr->exp_vsize;
                tVar19 = 0.0;
              }
              else {
                tVar19 = aVar11.v_vec[lVar10] / local_34;
              }
              ptVar6[lVar10] = tVar19;
              lVar10 = lVar10 + 1;
            } while ((int)lVar10 < iVar3);
          }
          goto LAB_00195983;
        }
LAB_0019585f:
        pcVar15 = "expr: ex_eval(%d): bad right type %ld\n";
        peVar5 = (ex_ex *)0x0;
      }
      else {
        if (lStack_50 == 2) {
          if (lStack_70 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar6 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) goto LAB_0019b5a3;
              optr->ex_type = 0xf;
              ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar6;
            }
            aVar7 = local_78;
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              local_34 = local_58.v_flt;
              lVar10 = 0;
              do {
                fVar18 = aVar7.v_vec[lVar10];
                if ((fVar18 != 0.0) || (NAN(fVar18))) {
                  tVar19 = local_34 / fVar18;
                }
                else {
                  ex_dzdetect(expr);
                  iVar3 = expr->exp_vsize;
                  tVar19 = 0.0;
                }
                ptVar6[lVar10] = tVar19;
                lVar10 = lVar10 + 1;
              } while ((int)lVar10 < iVar3);
            }
            goto LAB_00195983;
          }
          if (lStack_70 == 2) {
            if (optr->ex_type == 0xf) {
              ptVar6 = (optr->ex_cont).v_vec;
              local_34 = 0.0;
              if ((local_78.v_flt != 0.0) || (NAN(local_78.v_flt))) {
                local_34 = local_58.v_flt / local_78.v_flt;
              }
              else {
                ex_dzdetect(expr);
              }
              auVar2 = _DAT_001b53a0;
              auVar88 = _DAT_001b5390;
              auVar87 = _DAT_001b5380;
              iVar3 = expr->exp_vsize;
              if (0 < (long)iVar3) {
                lVar10 = (long)iVar3 + -1;
                auVar21._8_4_ = (int)lVar10;
                auVar21._0_8_ = lVar10;
                auVar21._12_4_ = (int)((ulong)lVar10 >> 0x20);
                uVar12 = 0;
                auVar21 = auVar21 ^ _DAT_001b53a0;
                do {
                  auVar108._8_4_ = (int)uVar12;
                  auVar108._0_8_ = uVar12;
                  auVar108._12_4_ = (int)(uVar12 >> 0x20);
                  auVar25 = (auVar108 | auVar88) ^ auVar2;
                  iVar14 = auVar21._4_4_;
                  if ((bool)(~(auVar25._4_4_ == iVar14 && auVar21._0_4_ < auVar25._0_4_ ||
                              iVar14 < auVar25._4_4_) & 1)) {
                    ptVar6[uVar12] = local_34;
                  }
                  if ((auVar25._12_4_ != auVar21._12_4_ || auVar25._8_4_ <= auVar21._8_4_) &&
                      auVar25._12_4_ <= auVar21._12_4_) {
                    ptVar6[uVar12 + 1] = local_34;
                  }
                  auVar25 = (auVar108 | auVar87) ^ auVar2;
                  iVar189 = auVar25._4_4_;
                  if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar21._0_4_)) {
                    ptVar6[uVar12 + 2] = local_34;
                    ptVar6[uVar12 + 3] = local_34;
                  }
                  uVar12 = uVar12 + 4;
                } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
              }
              goto LAB_00195983;
            }
            optr->ex_type = 2;
            uVar9 = local_58.v_flt;
            if ((local_78.v_flt == 0.0) && (!NAN(local_78.v_flt))) {
LAB_00199fbb:
              local_34 = 0.0;
              ex_dzdetect(expr);
              tVar19 = local_34;
              goto LAB_00199fc9;
            }
LAB_00199a22:
            local_34 = (float)uVar9 / local_78.v_flt;
            tVar19 = local_34;
            goto LAB_00199fc9;
          }
          if (lStack_70 == 1) {
            if (optr->ex_type == 0xf) {
              ptVar6 = (optr->ex_cont).v_vec;
              if ((void *)local_78.v_int == (void *)0x0) {
                ex_dzdetect(expr);
                tVar19 = 0.0;
              }
              else {
                tVar19 = local_58.v_flt / (float)local_78.v_int;
              }
              auVar2 = _DAT_001b53a0;
              auVar88 = _DAT_001b5390;
              auVar87 = _DAT_001b5380;
              iVar3 = expr->exp_vsize;
              if (0 < (long)iVar3) {
                lVar10 = (long)iVar3 + -1;
                auVar106._8_4_ = (int)lVar10;
                auVar106._0_8_ = lVar10;
                auVar106._12_4_ = (int)((ulong)lVar10 >> 0x20);
                uVar12 = 0;
                auVar106 = auVar106 ^ _DAT_001b53a0;
                do {
                  auVar188._8_4_ = (int)uVar12;
                  auVar188._0_8_ = uVar12;
                  auVar188._12_4_ = (int)(uVar12 >> 0x20);
                  auVar25 = (auVar188 | auVar88) ^ auVar2;
                  iVar14 = auVar106._4_4_;
                  if ((bool)(~(auVar25._4_4_ == iVar14 && auVar106._0_4_ < auVar25._0_4_ ||
                              iVar14 < auVar25._4_4_) & 1)) {
                    ptVar6[uVar12] = tVar19;
                  }
                  if ((auVar25._12_4_ != auVar106._12_4_ || auVar25._8_4_ <= auVar106._8_4_) &&
                      auVar25._12_4_ <= auVar106._12_4_) {
                    ptVar6[uVar12 + 1] = tVar19;
                  }
                  auVar25 = (auVar188 | auVar87) ^ auVar2;
                  iVar189 = auVar25._4_4_;
                  if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar106._0_4_)) {
                    ptVar6[uVar12 + 2] = tVar19;
                    ptVar6[uVar12 + 3] = tVar19;
                  }
                  uVar12 = uVar12 + 4;
                } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
              }
              goto LAB_00195983;
            }
            optr->ex_type = 2;
            if ((void *)local_78.v_int != (void *)0x0) {
              tVar19 = local_58.v_flt / (float)local_78.v_int;
              goto LAB_00199fc9;
            }
            goto LAB_00199989;
          }
          goto LAB_0019585f;
        }
        if (lStack_50 == 1) {
          if (lStack_70 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar6 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) goto LAB_0019b5a3;
              optr->ex_type = 0xf;
              ptVar6 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar6;
            }
            aVar7 = local_78;
            iVar3 = expr->exp_vsize;
            if (0 < iVar3) {
              local_34 = (t_float)local_58.v_int;
              lVar10 = 0;
              do {
                fVar18 = aVar7.v_vec[lVar10];
                if ((fVar18 != 0.0) || (NAN(fVar18))) {
                  tVar19 = local_34 / fVar18;
                }
                else {
                  ex_dzdetect(expr);
                  iVar3 = expr->exp_vsize;
                  tVar19 = 0.0;
                }
                ptVar6[lVar10] = tVar19;
                lVar10 = lVar10 + 1;
              } while ((int)lVar10 < iVar3);
            }
            goto LAB_00195983;
          }
          if (lStack_70 == 2) {
            if (optr->ex_type == 0xf) {
              ptVar6 = (optr->ex_cont).v_vec;
              local_34 = 0.0;
              if ((local_78.v_flt != 0.0) || (NAN(local_78.v_flt))) {
                local_34 = (float)local_58.v_int / local_78.v_flt;
              }
              else {
                ex_dzdetect(expr);
              }
              auVar2 = _DAT_001b53a0;
              auVar88 = _DAT_001b5390;
              auVar87 = _DAT_001b5380;
              iVar3 = expr->exp_vsize;
              if (0 < (long)iVar3) {
                lVar10 = (long)iVar3 + -1;
                auVar20._8_4_ = (int)lVar10;
                auVar20._0_8_ = lVar10;
                auVar20._12_4_ = (int)((ulong)lVar10 >> 0x20);
                uVar12 = 0;
                auVar20 = auVar20 ^ _DAT_001b53a0;
                do {
                  auVar107._8_4_ = (int)uVar12;
                  auVar107._0_8_ = uVar12;
                  auVar107._12_4_ = (int)(uVar12 >> 0x20);
                  auVar25 = (auVar107 | auVar88) ^ auVar2;
                  iVar14 = auVar20._4_4_;
                  if ((bool)(~(auVar25._4_4_ == iVar14 && auVar20._0_4_ < auVar25._0_4_ ||
                              iVar14 < auVar25._4_4_) & 1)) {
                    ptVar6[uVar12] = local_34;
                  }
                  if ((auVar25._12_4_ != auVar20._12_4_ || auVar25._8_4_ <= auVar20._8_4_) &&
                      auVar25._12_4_ <= auVar20._12_4_) {
                    ptVar6[uVar12 + 1] = local_34;
                  }
                  auVar25 = (auVar107 | auVar87) ^ auVar2;
                  iVar189 = auVar25._4_4_;
                  if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar20._0_4_)) {
                    ptVar6[uVar12 + 2] = local_34;
                    ptVar6[uVar12 + 3] = local_34;
                  }
                  uVar12 = uVar12 + 4;
                } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
              }
              goto LAB_00195983;
            }
            optr->ex_type = 2;
            if ((local_78.v_flt == 0.0) && (!NAN(local_78.v_flt))) goto LAB_00199fbb;
            uVar9 = (float)local_58.v_int;
            goto LAB_00199a22;
          }
          if (lStack_70 == 1) {
            if (optr->ex_type == 0xf) {
              ptVar6 = (optr->ex_cont).v_vec;
              if ((void *)local_78.v_int == (void *)0x0) {
                ex_dzdetect(expr);
                tVar19 = 0.0;
              }
              else {
                tVar19 = (t_float)(local_58.v_int / local_78.v_int);
              }
              auVar2 = _DAT_001b53a0;
              auVar88 = _DAT_001b5390;
              auVar87 = _DAT_001b5380;
              iVar3 = expr->exp_vsize;
              if (0 < (long)iVar3) {
                lVar10 = (long)iVar3 + -1;
                auVar105._8_4_ = (int)lVar10;
                auVar105._0_8_ = lVar10;
                auVar105._12_4_ = (int)((ulong)lVar10 >> 0x20);
                uVar12 = 0;
                auVar105 = auVar105 ^ _DAT_001b53a0;
                do {
                  auVar187._8_4_ = (int)uVar12;
                  auVar187._0_8_ = uVar12;
                  auVar187._12_4_ = (int)(uVar12 >> 0x20);
                  auVar25 = (auVar187 | auVar88) ^ auVar2;
                  iVar14 = auVar105._4_4_;
                  if ((bool)(~(auVar25._4_4_ == iVar14 && auVar105._0_4_ < auVar25._0_4_ ||
                              iVar14 < auVar25._4_4_) & 1)) {
                    ptVar6[uVar12] = tVar19;
                  }
                  if ((auVar25._12_4_ != auVar105._12_4_ || auVar25._8_4_ <= auVar105._8_4_) &&
                      auVar25._12_4_ <= auVar105._12_4_) {
                    ptVar6[uVar12 + 1] = tVar19;
                  }
                  auVar25 = (auVar187 | auVar87) ^ auVar2;
                  iVar189 = auVar25._4_4_;
                  if (iVar189 <= iVar14 && (iVar189 != iVar14 || auVar25._0_4_ <= auVar105._0_4_)) {
                    ptVar6[uVar12 + 2] = tVar19;
                    ptVar6[uVar12 + 3] = tVar19;
                  }
                  uVar12 = uVar12 + 4;
                } while ((iVar3 + 3U & 0xfffffffc) != uVar12);
              }
              goto LAB_00195983;
            }
            optr->ex_type = 1;
            if ((void *)local_78.v_int == (void *)0x0) {
LAB_00199fac:
              ex_dzdetect(expr);
              aVar7.v_int = 0;
            }
            else {
              aVar7.v_int = local_58.v_int / local_78.v_int;
            }
            goto LAB_00199cf4;
          }
          goto LAB_0019585f;
        }
        pcVar15 = "expr: ex_eval(%d): bad left type %ld\n";
      }
      uVar16 = 0x4f3;
    }
LAB_0019597c:
    pd_error(expr,pcVar15,uVar16);
LAB_00195983:
    if (lStack_50 == 0xf) {
      free(local_58.v_vec);
    }
    if (lStack_70 != 0xf) {
      return peVar5;
    }
    free(local_78.v_vec);
    return peVar5;
  default:
    pcVar15 = "expr: ex_eval: unexpected type %d\n";
    goto LAB_0019141e;
  case 5:
  case 0xd:
    peVar5 = eval_tab(expr,eptr,optr,idx);
    return peVar5;
  case 6:
    peVar5 = eval_func(expr,eptr,optr,idx);
    return peVar5;
  case 7:
    if (optr->ex_type == 0xf) {
      pcVar15 = "expr: ex_eval: cannot turn string to vector\n";
      goto LAB_00191d14;
    }
    break;
  case 8:
    if (optr->ex_type == 0xf) {
      pcVar15 = "expr: IntErr. vsym in for vec out\n";
      goto LAB_00191d14;
    }
    if ((eptr->ex_cont).v_int == -1) goto LAB_00191af8;
    optr->ex_type = 7;
    goto LAB_00191b5c;
  case 0xb:
    if ((eptr->ex_cont).v_int == -1) {
LAB_00191af8:
      pcVar15 = "expr: ex_eval: inlet number not set\n";
LAB_00191d14:
      pd_error(expr,pcVar15);
      return (ex_ex *)0x0;
    }
    if (optr->ex_type == 0xf) {
      uVar12 = (ulong)(uint)expr->exp_vsize;
      if (uVar12 != 0) {
        fVar18 = (float)expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_int;
        ptVar6 = (optr->ex_cont).v_vec;
        lVar10 = uVar12 - 1;
        auVar190._8_4_ = (int)lVar10;
        auVar190._0_8_ = lVar10;
        auVar190._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar13 = 0;
        auVar190 = auVar190 ^ _DAT_001b53a0;
        do {
          auVar113._8_4_ = (int)uVar13;
          auVar113._0_8_ = uVar13;
          auVar113._12_4_ = (int)(uVar13 >> 0x20);
          auVar25 = (auVar113 | auVar88) ^ auVar2;
          iVar3 = auVar190._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar3 && auVar190._0_4_ < auVar25._0_4_ ||
                      iVar3 < auVar25._4_4_) & 1)) {
            ptVar6[uVar13] = fVar18;
          }
          if ((auVar25._12_4_ != auVar190._12_4_ || auVar25._8_4_ <= auVar190._8_4_) &&
              auVar25._12_4_ <= auVar190._12_4_) {
            ptVar6[uVar13 + 1] = fVar18;
          }
          auVar25 = (auVar113 | auVar87) ^ auVar2;
          iVar14 = auVar25._4_4_;
          if (iVar14 <= iVar3 && (iVar14 != iVar3 || auVar25._0_4_ <= auVar190._0_4_)) {
            ptVar6[uVar13 + 2] = fVar18;
            ptVar6[uVar13 + 3] = fVar18;
          }
          uVar13 = uVar13 + 4;
        } while ((uVar12 + 3 & 0xfffffffffffffffc) != uVar13);
      }
      goto LAB_00191b6f;
    }
    optr->ex_type = 1;
LAB_00191b5c:
    optr->ex_cont = expr->exp_var[(eptr->ex_cont).v_int].ex_cont;
    goto LAB_00191b6f;
  case 0xc:
    if ((eptr->ex_cont).v_int == -1) goto LAB_00191af8;
    if (optr->ex_type == 0xf) {
      uVar12 = (ulong)(uint)expr->exp_vsize;
      if (uVar12 != 0) {
        tVar19 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_flt;
        ptVar6 = (optr->ex_cont).v_vec;
        lVar10 = uVar12 - 1;
        auVar25._8_4_ = (int)lVar10;
        auVar25._0_8_ = lVar10;
        auVar25._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar13 = 0;
        auVar25 = auVar25 ^ _DAT_001b53a0;
        do {
          auVar112._8_4_ = (int)uVar13;
          auVar112._0_8_ = uVar13;
          auVar112._12_4_ = (int)(uVar13 >> 0x20);
          auVar190 = (auVar112 | auVar88) ^ auVar2;
          iVar3 = auVar25._4_4_;
          if ((bool)(~(auVar190._4_4_ == iVar3 && auVar25._0_4_ < auVar190._0_4_ ||
                      iVar3 < auVar190._4_4_) & 1)) {
            ptVar6[uVar13] = tVar19;
          }
          if ((auVar190._12_4_ != auVar25._12_4_ || auVar190._8_4_ <= auVar25._8_4_) &&
              auVar190._12_4_ <= auVar25._12_4_) {
            ptVar6[uVar13 + 1] = tVar19;
          }
          auVar112 = (auVar112 | auVar87) ^ auVar2;
          iVar14 = auVar112._4_4_;
          if (iVar14 <= iVar3 && (iVar14 != iVar3 || auVar112._0_4_ <= auVar25._0_4_)) {
            ptVar6[uVar13 + 2] = tVar19;
            ptVar6[uVar13 + 3] = tVar19;
          }
          uVar13 = uVar13 + 4;
        } while ((uVar12 + 3 & 0xfffffffffffffffc) != uVar13);
      }
      goto LAB_00191b6f;
    }
    optr->ex_type = 2;
    tVar19 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_flt;
    goto LAB_00191b4d;
  case 0xe:
    if (optr->ex_type == 0xf) {
      ptVar6 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_vec;
      if ((optr->ex_cont).v_vec != ptVar6) {
        memcpy((optr->ex_cont).v_vec,ptVar6,(long)expr->exp_vsize << 2);
      }
      goto LAB_00191b6f;
    }
    lVar10 = (eptr->ex_cont).v_int;
    optr->ex_end = expr->exp_var[lVar10].ex_end;
    aVar7 = expr->exp_var[lVar10].ex_cont;
    aVar11 = (&expr->exp_var[lVar10].ex_cont)[1];
    goto LAB_00191b21;
  case 0xf:
    if (optr->ex_type == 0xf) {
      ptVar6 = (optr->ex_cont).v_vec;
      if (ptVar6 == (eptr->ex_cont).v_vec) {
        post("expr int. error, optr->ex_vec = %d",ptVar6);
        abort();
      }
      memcpy(ptVar6,(eptr->ex_cont).v_vec,(long)expr->exp_vsize << 2);
      free((eptr->ex_cont).v_vec);
    }
    else {
      optr->ex_type = 0xf;
      optr->ex_cont = eptr->ex_cont;
      eptr->ex_type = 1;
      (eptr->ex_cont).v_int = 0;
    }
    goto LAB_00191b6f;
  case 0x10:
  case 0x12:
    if (((expr->exp_flags & 3U) == 0) && (optr->ex_type != 0xf)) {
      peVar5 = eval_sigidx(expr,eptr,optr,idx);
      return peVar5;
    }
    pcVar15 = "%d:expr->exp_flags = %d";
    uVar16 = 0x495;
LAB_0019b53d:
    post(pcVar15,uVar16);
    abort();
  case 0x11:
    optr->ex_type = 2;
    lVar10 = 0x1f98;
    if (idx == 0) {
      idx = expr->exp_vsize;
      lVar10 = 0x1c78;
    }
    tVar19 = *(t_float *)
              (*(long *)((long)expr->exp_outlet + (eptr->ex_cont).v_int * 8 + lVar10 + -0x50) + -4 +
              (long)idx * 4);
    goto LAB_00191b4d;
  case 0x14:
    if (((expr->exp_flags & 3U) != 0) || (optr->ex_type == 0xf)) {
      pcVar15 = "%d:exp->exp_flags = %d";
      uVar16 = 0x47d;
      goto LAB_0019b53d;
    }
    optr->ex_type = 2;
    tVar19 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_vec[idx];
LAB_00191b4d:
    (optr->ex_cont).v_flt = tVar19;
    goto LAB_00191b6f;
  case 0x15:
    peVar5 = eval_var(expr,eptr,optr,idx);
    return peVar5;
  }
  optr->ex_end = eptr->ex_end;
  aVar7 = eptr->ex_cont;
  aVar11 = (anon_union_8_5_735de1bb_for_ex_cont)eptr->ex_type;
LAB_00191b21:
  optr->ex_cont = aVar7;
  optr->ex_type = (long)aVar11;
LAB_00191b6f:
  return eptr + 1;
}

Assistant:

struct ex_ex *
ex_eval(struct expr *expr, struct ex_ex *eptr, struct ex_ex *optr, int idx)
/* the expr object data pointer */
/* the operation stack */
/* the result pointer */
/* the sample number processed for fexpr~ */
{
        int i, j;
        t_float *lp, *rp, *op; /* left, right, and out pointer to vectors */
        t_float scalar;
        int nullret = 0;                /* did we have an error */
        struct ex_ex left = { 0 }, right = { 0 };       /* left and right operands */

        left.ex_type = 0;
        left.ex_int = 0;
        right.ex_type = 0;
        right.ex_int = 0;

        if (!eptr)
                return (exNULL);
        switch (eptr->ex_type) {
        case ET_INT:
                if (optr->ex_type == ET_VEC)
                        ex_mkvector(optr->ex_vec, (t_float) eptr->ex_int,
                                                                expr->exp_vsize);
                else
                        *optr = *eptr;
                return (++eptr);

        case ET_FLT:

                if (optr->ex_type == ET_VEC)
                        ex_mkvector(optr->ex_vec, eptr->ex_flt, expr->exp_vsize);
                else
                        *optr = *eptr;
                return (++eptr);

        case ET_SYM:
                if (optr->ex_type == ET_VEC) {
                        post_error((fts_object_t *) expr,
                              "expr: ex_eval: cannot turn string to vector\n");
                        return (exNULL);
                }
                *optr = *eptr;
                return (++eptr);
        case ET_II:
                if (eptr->ex_int == -1) {
                        post_error((fts_object_t *) expr,
                            "expr: ex_eval: inlet number not set\n");
                        return (exNULL);
                }
                if (optr->ex_type == ET_VEC) {
                        ex_mkvector(optr->ex_vec,
                               (t_float)expr->exp_var[eptr->ex_int].ex_int,
                                                                expr->exp_vsize);
                } else {
                        optr->ex_type = ET_INT;
                        optr->ex_int = expr->exp_var[eptr->ex_int].ex_int;
                }
                return (++eptr);
        case ET_FI:
                if (eptr->ex_int == -1) {
                        post_error((fts_object_t *) expr,
                            "expr: ex_eval: inlet number not set\n");
                        return (exNULL);
                }
                if (optr->ex_type == ET_VEC) {
                        ex_mkvector(optr->ex_vec,
                             expr->exp_var[eptr->ex_int].ex_flt, expr->exp_vsize);
                } else {
                        optr->ex_type = ET_FLT;
                        optr->ex_flt = expr->exp_var[eptr->ex_int].ex_flt;
                }
                return (++eptr);

        case ET_VSYM:
                if (optr->ex_type == ET_VEC) {
                        post_error((fts_object_t *) expr,
                            "expr: IntErr. vsym in for vec out\n");
                        return (exNULL);
                }
                if (eptr->ex_int == -1) {
                        post_error((fts_object_t *) expr,
                                "expr: ex_eval: inlet number not set\n");
                        return (exNULL);
                }
                optr->ex_type = ET_SYM;
                optr->ex_ptr = expr->exp_var[eptr->ex_int].ex_ptr;
                return(++eptr);

        case ET_VI:
                if (optr->ex_type != ET_VEC)
                        *optr = expr->exp_var[eptr->ex_int];
                else if (optr->ex_vec != expr->exp_var[eptr->ex_int].ex_vec)
                        memcpy(optr->ex_vec, expr->exp_var[eptr->ex_int].ex_vec,
                                        expr->exp_vsize * sizeof (t_float));
                return(++eptr);
        case ET_VEC:
                if (optr->ex_type != ET_VEC) {
                        optr->ex_type = ET_VEC;
                        optr->ex_vec = eptr->ex_vec;
                        eptr->ex_type = ET_INT;
                        eptr->ex_int = 0;
                } else if (optr->ex_vec != eptr->ex_vec) {
                        memcpy(optr->ex_vec, eptr->ex_vec,
                                        expr->exp_vsize * sizeof (t_float));
                        fts_free(eptr->ex_vec);
                } else { /* this should not happen */
                        post("expr int. error, optr->ex_vec = %d",optr->ex_vec);
                        abort();
                }
                return(++eptr);
        case ET_XI0:
                /* short hand for $x?[0] */

                /* SDY delete the following check */
                if (!IS_FEXPR_TILDE(expr) || optr->ex_type==ET_VEC) {
                        post("%d:exp->exp_flags = %d", __LINE__,expr->exp_flags);
                        abort();
                }
                optr->ex_type = ET_FLT;
                optr->ex_flt = expr->exp_var[eptr->ex_int].ex_vec[idx];
                return(++eptr);
        case ET_YOM1:
                /*
                 * short hand for $y?[-1]
                 * if we are calculating the first sample of the vector
                 * we need to look at the previous results buffer
                 */
                optr->ex_type = ET_FLT;
                if (idx == 0)
                        optr->ex_flt =
                        expr->exp_p_res[eptr->ex_int][expr->exp_vsize - 1];
                else
                        optr->ex_flt=expr->exp_tmpres[eptr->ex_int][idx-1];
                return(++eptr);

        case ET_YO:
        case ET_XI:
                /* SDY delete the following */
                if (!IS_FEXPR_TILDE(expr) || optr->ex_type==ET_VEC) {
                        post("%d:expr->exp_flags = %d", __LINE__,expr->exp_flags);
                        abort();
                }
                return (eval_sigidx(expr, eptr, optr, idx));

        case ET_TBL:
        case ET_SI:
                return (eval_tab(expr, eptr, optr, idx));
        case ET_FUNC:
                return (eval_func(expr, eptr, optr, idx));
        case ET_VAR:
                return (eval_var(expr, eptr, optr, idx));
        case ET_OP:
                break;
        case ET_STR:
        case ET_LP:
        case ET_LB:
        default:
                post_error((fts_object_t *) expr,
                        "expr: ex_eval: unexpected type %d\n",
                            (int)eptr->ex_type);
                return (exNULL);
        }
        if (!eptr[1].ex_type) {
                post_error((fts_object_t *) expr,
                                        "expr: ex_eval: not enough nodes 1\n");
                return (exNULL);
        }
        if (!unary_op(eptr->ex_op) && !eptr[2].ex_type) {
                post_error((fts_object_t *) expr,
                                        "expr: ex_eval: not enough nodes 2\n");
                return (exNULL);
        }

        switch((eptr++)->ex_op) {
        case OP_STORE:
                return (eval_store(expr, eptr, optr, idx));
        case OP_NOT:
                EVAL_UNARY(!, +);
        case OP_NEG:
                EVAL_UNARY(~, (long));
        case OP_UMINUS:
                EVAL_UNARY(-, +);
        case OP_MUL:
                EVAL(*);
        case OP_ADD:
                EVAL(+);
        case OP_SUB:
                EVAL(-);
        case OP_LT:
                EVAL(<);
        case OP_LE:
                EVAL(<=);
        case OP_GT:
                EVAL(>);
        case OP_GE:
                EVAL(>=);
        case OP_EQ:
                EVAL(==);
        case OP_NE:
                EVAL(!=);
/*
 * following operators convert their argument to integer
 */
#undef DZC
#define DZC(ARG1,OPR,ARG2)      (((int)ARG1) OPR ((int)ARG2))
        case OP_SL:
                EVAL(<<);
        case OP_SR:
                EVAL(>>);
        case OP_AND:
                EVAL(&);
        case OP_XOR:
                EVAL(^);
        case OP_OR:
                EVAL(|);
        case OP_LAND:
                EVAL(&&);
        case OP_LOR:
                EVAL(||);
/*
 * for modulo we need to convert to integer and check for divide by zero
 */
#undef DZC
#define DZC(ARG1,OPR,ARG2)      ((((int)ARG2)?(((int)ARG1) OPR ((int)ARG2)) \
                                                        : (ex_dzdetect(expr),0)))
        case OP_MOD:
                EVAL(%);
/*
 * define the divide by zero check for divide
 */
#undef DZC
#define DZC(ARG1,OPR,ARG2)      (((ARG2)?(ARG1 OPR ARG2):(ex_dzdetect(expr),0)))
        case OP_DIV:
                EVAL(/);
        case OP_LP:
        case OP_RP:
        case OP_LB:
        case OP_RB:
        case OP_COMMA:
        case OP_SEMI:
        default:
                post_error((fts_object_t *) expr,
                    "expr: ex_print: bad op 0x%x\n", (unsigned)eptr->ex_op);
                return (exNULL);
        }


        /*
         * the left and right nodes could have been transformed to vectors
         * down the chain
         */
        if (left.ex_type == ET_VEC)
                fts_free(left.ex_vec);
        if (right.ex_type == ET_VEC)
                fts_free(right.ex_vec);
        if (nullret)
                return (exNULL);
        else
                return (eptr);
}